

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  int iVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  byte bVar61;
  ulong uVar62;
  ulong uVar63;
  bool bVar64;
  Geometry *geometry;
  long lVar65;
  uint uVar66;
  ulong uVar67;
  byte bVar68;
  float fVar69;
  float fVar70;
  float fVar116;
  float fVar118;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar78 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar79 [16];
  float fVar117;
  float fVar119;
  float fVar121;
  float fVar122;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  float fVar120;
  float fVar123;
  float fVar124;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined4 uVar125;
  float fVar130;
  float fVar131;
  vint4 bi_2;
  float fVar132;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined8 uVar133;
  vint4 bi_1;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 ai_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar165;
  float fVar169;
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  uint uVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [16];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  LinearSpace3fa *local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  uint local_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined8 local_400;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined1 local_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar183 [64];
  
  PVar8 = prim[1];
  uVar63 = (ulong)(byte)PVar8;
  fVar142 = *(float *)(prim + uVar63 * 0x19 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar75 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + uVar63 * 0x19 + 6));
  auVar143._0_4_ = fVar142 * auVar75._0_4_;
  auVar143._4_4_ = fVar142 * auVar75._4_4_;
  auVar143._8_4_ = fVar142 * auVar75._8_4_;
  auVar143._12_4_ = fVar142 * auVar75._12_4_;
  auVar78._0_4_ = fVar142 * auVar73._0_4_;
  auVar78._4_4_ = fVar142 * auVar73._4_4_;
  auVar78._8_4_ = fVar142 * auVar73._8_4_;
  auVar78._12_4_ = fVar142 * auVar73._12_4_;
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xb + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar63 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar67 = (ulong)(uint)((int)(uVar63 * 9) * 2);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar190 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 + uVar63 + 6)));
  auVar190 = vcvtdq2ps_avx(auVar190);
  uVar62 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar179._4_4_ = auVar78._0_4_;
  auVar179._0_4_ = auVar78._0_4_;
  auVar179._8_4_ = auVar78._0_4_;
  auVar179._12_4_ = auVar78._0_4_;
  auVar76 = vshufps_avx(auVar78,auVar78,0x55);
  auVar74 = vshufps_avx(auVar78,auVar78,0xaa);
  fVar142 = auVar74._0_4_;
  auVar79._0_4_ = fVar142 * auVar77._0_4_;
  fVar130 = auVar74._4_4_;
  auVar79._4_4_ = fVar130 * auVar77._4_4_;
  fVar131 = auVar74._8_4_;
  auVar79._8_4_ = fVar131 * auVar77._8_4_;
  fVar132 = auVar74._12_4_;
  auVar79._12_4_ = fVar132 * auVar77._12_4_;
  auVar134._0_4_ = auVar22._0_4_ * fVar142;
  auVar134._4_4_ = auVar22._4_4_ * fVar130;
  auVar134._8_4_ = auVar22._8_4_ * fVar131;
  auVar134._12_4_ = auVar22._12_4_ * fVar132;
  auVar126._0_4_ = auVar24._0_4_ * fVar142;
  auVar126._4_4_ = auVar24._4_4_ * fVar130;
  auVar126._8_4_ = auVar24._8_4_ * fVar131;
  auVar126._12_4_ = auVar24._12_4_ * fVar132;
  auVar74 = vfmadd231ps_fma(auVar79,auVar76,auVar73);
  auVar72 = vfmadd231ps_fma(auVar134,auVar76,auVar21);
  auVar76 = vfmadd231ps_fma(auVar126,auVar190,auVar76);
  auVar71 = vfmadd231ps_fma(auVar74,auVar179,auVar75);
  auVar72 = vfmadd231ps_fma(auVar72,auVar179,auVar20);
  auVar78 = vfmadd231ps_fma(auVar76,auVar23,auVar179);
  auVar180._4_4_ = auVar143._0_4_;
  auVar180._0_4_ = auVar143._0_4_;
  auVar180._8_4_ = auVar143._0_4_;
  auVar180._12_4_ = auVar143._0_4_;
  auVar76 = vshufps_avx(auVar143,auVar143,0x55);
  auVar74 = vshufps_avx(auVar143,auVar143,0xaa);
  fVar142 = auVar74._0_4_;
  auVar184._0_4_ = fVar142 * auVar77._0_4_;
  fVar130 = auVar74._4_4_;
  auVar184._4_4_ = fVar130 * auVar77._4_4_;
  fVar131 = auVar74._8_4_;
  auVar184._8_4_ = fVar131 * auVar77._8_4_;
  fVar132 = auVar74._12_4_;
  auVar184._12_4_ = fVar132 * auVar77._12_4_;
  auVar152._0_4_ = auVar22._0_4_ * fVar142;
  auVar152._4_4_ = auVar22._4_4_ * fVar130;
  auVar152._8_4_ = auVar22._8_4_ * fVar131;
  auVar152._12_4_ = auVar22._12_4_ * fVar132;
  auVar144._0_4_ = auVar24._0_4_ * fVar142;
  auVar144._4_4_ = auVar24._4_4_ * fVar130;
  auVar144._8_4_ = auVar24._8_4_ * fVar131;
  auVar144._12_4_ = auVar24._12_4_ * fVar132;
  auVar73 = vfmadd231ps_fma(auVar184,auVar76,auVar73);
  auVar77 = vfmadd231ps_fma(auVar152,auVar76,auVar21);
  auVar21 = vfmadd231ps_fma(auVar144,auVar76,auVar190);
  auVar22 = vfmadd231ps_fma(auVar73,auVar180,auVar75);
  auVar190 = vfmadd231ps_fma(auVar77,auVar180,auVar20);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar24 = vfmadd231ps_fma(auVar21,auVar180,auVar23);
  auVar75 = vandps_avx(auVar71,auVar170);
  auVar166._8_4_ = 0x219392ef;
  auVar166._0_8_ = 0x219392ef219392ef;
  auVar166._12_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar75,auVar166,1);
  bVar64 = (bool)((byte)uVar67 & 1);
  auVar74._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._0_4_;
  bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._4_4_;
  bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._8_4_;
  bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar71._12_4_;
  auVar75 = vandps_avx(auVar72,auVar170);
  uVar67 = vcmpps_avx512vl(auVar75,auVar166,1);
  bVar64 = (bool)((byte)uVar67 & 1);
  auVar71._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._0_4_;
  bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._4_4_;
  bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._8_4_;
  bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar72._12_4_;
  auVar75 = vandps_avx(auVar78,auVar170);
  uVar67 = vcmpps_avx512vl(auVar75,auVar166,1);
  bVar64 = (bool)((byte)uVar67 & 1);
  auVar72._0_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._0_4_;
  bVar64 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._4_4_;
  bVar64 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._8_4_;
  bVar64 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar64 * 0x219392ef | (uint)!bVar64 * auVar78._12_4_;
  auVar73 = vrcp14ps_avx512vl(auVar74);
  auVar167._8_4_ = 0x3f800000;
  auVar167._0_8_ = 0x3f8000003f800000;
  auVar167._12_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar74,auVar73,auVar167);
  auVar20 = vfmadd132ps_fma(auVar75,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar75 = vfnmadd213ps_fma(auVar71,auVar73,auVar167);
  auVar21 = vfmadd132ps_fma(auVar75,auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar72);
  auVar75 = vfnmadd213ps_fma(auVar72,auVar73,auVar167);
  auVar23 = vfmadd132ps_fma(auVar75,auVar73,auVar73);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar75 = vpmovsxwd_avx(auVar75);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar22);
  auVar160._0_4_ = auVar20._0_4_ * auVar75._0_4_;
  auVar160._4_4_ = auVar20._4_4_ * auVar75._4_4_;
  auVar160._8_4_ = auVar20._8_4_ * auVar75._8_4_;
  auVar160._12_4_ = auVar20._12_4_ * auVar75._12_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar75 = vpmovsxwd_avx(auVar73);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar22);
  auVar74 = vpbroadcastd_avx512vl();
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar73 = vpmovsxwd_avx(auVar77);
  auVar139._0_4_ = auVar20._0_4_ * auVar75._0_4_;
  auVar139._4_4_ = auVar20._4_4_ * auVar75._4_4_;
  auVar139._8_4_ = auVar20._8_4_ * auVar75._8_4_;
  auVar139._12_4_ = auVar20._12_4_ * auVar75._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar63 * -2 + 6);
  auVar75 = vpmovsxwd_avx(auVar20);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar190);
  auVar168._0_4_ = auVar21._0_4_ * auVar75._0_4_;
  auVar168._4_4_ = auVar21._4_4_ * auVar75._4_4_;
  auVar168._8_4_ = auVar21._8_4_ * auVar75._8_4_;
  auVar168._12_4_ = auVar21._12_4_ * auVar75._12_4_;
  auVar75 = vcvtdq2ps_avx(auVar73);
  auVar75 = vsubps_avx(auVar75,auVar190);
  auVar135._0_4_ = auVar21._0_4_ * auVar75._0_4_;
  auVar135._4_4_ = auVar21._4_4_ * auVar75._4_4_;
  auVar135._8_4_ = auVar21._8_4_ * auVar75._8_4_;
  auVar135._12_4_ = auVar21._12_4_ * auVar75._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar62 + uVar63 + 6);
  auVar75 = vpmovsxwd_avx(auVar21);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar24);
  auVar153._0_4_ = auVar23._0_4_ * auVar75._0_4_;
  auVar153._4_4_ = auVar23._4_4_ * auVar75._4_4_;
  auVar153._8_4_ = auVar23._8_4_ * auVar75._8_4_;
  auVar153._12_4_ = auVar23._12_4_ * auVar75._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar63 * 0x17 + 6);
  auVar75 = vpmovsxwd_avx(auVar22);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,auVar24);
  auVar127._0_4_ = auVar23._0_4_ * auVar75._0_4_;
  auVar127._4_4_ = auVar23._4_4_ * auVar75._4_4_;
  auVar127._8_4_ = auVar23._8_4_ * auVar75._8_4_;
  auVar127._12_4_ = auVar23._12_4_ * auVar75._12_4_;
  auVar75 = vpminsd_avx(auVar160,auVar139);
  auVar73 = vpminsd_avx(auVar168,auVar135);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar73 = vpminsd_avx(auVar153,auVar127);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar23._4_4_ = uVar125;
  auVar23._0_4_ = uVar125;
  auVar23._8_4_ = uVar125;
  auVar23._12_4_ = uVar125;
  auVar73 = vmaxps_avx512vl(auVar73,auVar23);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar190._8_4_ = 0x3f7ffffa;
  auVar190._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar190._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar75,auVar190);
  auVar75 = vpmaxsd_avx(auVar160,auVar139);
  auVar73 = vpmaxsd_avx(auVar168,auVar135);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar73 = vpmaxsd_avx(auVar153,auVar127);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar24._4_4_ = uVar125;
  auVar24._0_4_ = uVar125;
  auVar24._8_4_ = uVar125;
  auVar24._12_4_ = uVar125;
  auVar73 = vminps_avx512vl(auVar73,auVar24);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar76._8_4_ = 0x3f800003;
  auVar76._0_8_ = 0x3f8000033f800003;
  auVar76._12_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar76);
  uVar25 = vcmpps_avx512vl(local_3d0,auVar75,2);
  uVar67 = vpcmpgtd_avx512vl(auVar74,_DAT_01f7fcf0);
  uVar67 = ((byte)uVar25 & 0xf) & uVar67;
  if ((char)uVar67 == '\0') {
    bVar64 = false;
  }
  else {
    local_548 = pre->ray_space + k;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar93 = local_440;
      lVar27 = 0;
      for (uVar62 = uVar67; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar66 = *(uint *)(prim + 2);
      pGVar10 = (context->scene->geometries).items[uVar66].ptr;
      local_420._0_8_ = CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6));
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                               pGVar10[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6)));
      p_Var11 = pGVar10[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar10[1].time_range.upper;
      auVar75 = *(undefined1 (*) [16])(lVar27 + (long)p_Var11 * uVar62);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar62 + 1) * (long)p_Var11);
      uVar25 = *(undefined8 *)*pauVar3;
      uVar56 = *(undefined8 *)(*pauVar3 + 8);
      auVar23 = *pauVar3;
      auVar21 = *pauVar3;
      auVar73 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar62 + 2) * (long)p_Var11);
      uVar57 = *(undefined8 *)*pauVar4;
      uVar58 = *(undefined8 *)(*pauVar4 + 8);
      auVar22 = *pauVar4;
      auVar20 = *pauVar4;
      auVar77 = *pauVar4;
      uVar67 = uVar67 - 1 & uVar67;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar62 + 3) * (long)p_Var11);
      local_560 = (float)*(undefined8 *)*pauVar5;
      fStack_55c = (float)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
      fStack_558 = (float)*(undefined8 *)(*pauVar5 + 8);
      fStack_554 = (float)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
      if (uVar67 != 0) {
        uVar63 = uVar67 - 1 & uVar67;
        for (uVar62 = uVar67; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        }
        if (uVar63 != 0) {
          for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar190 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar190 = vinsertps_avx(auVar190,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar76 = vsubps_avx(auVar75,auVar190);
      uVar125 = auVar76._0_4_;
      auVar140._4_4_ = uVar125;
      auVar140._0_4_ = uVar125;
      auVar140._8_4_ = uVar125;
      auVar140._12_4_ = uVar125;
      auVar24 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      aVar6 = (local_548->vx).field_0;
      aVar7 = (local_548->vy).field_0;
      fVar142 = (local_548->vz).field_0.m128[0];
      fVar130 = *(float *)((long)&(local_548->vz).field_0 + 4);
      fVar131 = *(float *)((long)&(local_548->vz).field_0 + 8);
      fVar132 = *(float *)((long)&(local_548->vz).field_0 + 0xc);
      auVar173._0_4_ = fVar142 * auVar76._0_4_;
      auVar173._4_4_ = fVar130 * auVar76._4_4_;
      auVar173._8_4_ = fVar131 * auVar76._8_4_;
      auVar173._12_4_ = fVar132 * auVar76._12_4_;
      auVar24 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar24);
      auVar72 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar6,auVar140);
      auVar24 = vshufps_avx(auVar75,auVar75,0xff);
      auVar74 = vsubps_avx(auVar73,auVar190);
      uVar125 = auVar74._0_4_;
      auVar145._4_4_ = uVar125;
      auVar145._0_4_ = uVar125;
      auVar145._8_4_ = uVar125;
      auVar145._12_4_ = uVar125;
      auVar76 = vshufps_avx(auVar74,auVar74,0x55);
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar174._0_4_ = fVar142 * auVar74._0_4_;
      auVar174._4_4_ = fVar130 * auVar74._4_4_;
      auVar174._8_4_ = fVar131 * auVar74._8_4_;
      auVar174._12_4_ = fVar132 * auVar74._12_4_;
      auVar76 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar7,auVar76);
      auVar71 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar6,auVar145);
      auVar73 = vshufps_avx(auVar73,auVar73,0xff);
      auVar74 = vsubps_avx(auVar77,auVar190);
      uVar125 = auVar74._0_4_;
      auVar171._4_4_ = uVar125;
      auVar171._0_4_ = uVar125;
      auVar171._8_4_ = uVar125;
      auVar171._12_4_ = uVar125;
      auVar76 = vshufps_avx(auVar74,auVar74,0x55);
      auVar74 = vshufps_avx(auVar74,auVar74,0xaa);
      auVar177._0_4_ = fVar142 * auVar74._0_4_;
      auVar177._4_4_ = fVar130 * auVar74._4_4_;
      auVar177._8_4_ = fVar131 * auVar74._8_4_;
      auVar177._12_4_ = fVar132 * auVar74._12_4_;
      auVar76 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar7,auVar76);
      auVar74 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar6,auVar171);
      auVar77 = vshufps_avx(auVar77,auVar77,0xff);
      auVar59._12_4_ = fStack_554;
      auVar59._0_12_ = *pauVar5;
      auVar76 = vsubps_avx512vl(auVar59,auVar190);
      uVar125 = auVar76._0_4_;
      auVar146._4_4_ = uVar125;
      auVar146._0_4_ = uVar125;
      auVar146._8_4_ = uVar125;
      auVar146._12_4_ = uVar125;
      auVar190 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar178._0_4_ = fVar142 * auVar76._0_4_;
      auVar178._4_4_ = fVar130 * auVar76._4_4_;
      auVar178._8_4_ = fVar131 * auVar76._8_4_;
      auVar178._12_4_ = fVar132 * auVar76._12_4_;
      auVar190 = vfmadd231ps_fma(auVar178,(undefined1  [16])aVar7,auVar190);
      auVar190 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar6,auVar146);
      lVar27 = (long)iVar9 * 0x44;
      auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27);
      auVar76 = vshufps_avx512vl(auVar59,auVar59,0xff);
      local_500 = vbroadcastss_avx512vl(auVar72);
      auVar80._8_4_ = 1;
      auVar80._0_8_ = 0x100000001;
      auVar80._12_4_ = 1;
      auVar80._16_4_ = 1;
      auVar80._20_4_ = 1;
      auVar80._24_4_ = 1;
      auVar80._28_4_ = 1;
      local_4e0 = vpermps_avx512vl(auVar80,ZEXT1632(auVar72));
      uVar133 = auVar24._0_8_;
      local_80._8_8_ = uVar133;
      local_80._0_8_ = uVar133;
      local_80._16_8_ = uVar133;
      local_80._24_8_ = uVar133;
      auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x484);
      uVar125 = auVar71._0_4_;
      local_640._4_4_ = uVar125;
      local_640._0_4_ = uVar125;
      local_640._8_4_ = uVar125;
      local_640._12_4_ = uVar125;
      local_640._16_4_ = uVar125;
      local_640._20_4_ = uVar125;
      local_640._24_4_ = uVar125;
      local_640._28_4_ = uVar125;
      local_660 = vpermps_avx512vl(auVar80,ZEXT1632(auVar71));
      uVar133 = auVar73._0_8_;
      local_a0._8_8_ = uVar133;
      local_a0._0_8_ = uVar133;
      local_a0._16_8_ = uVar133;
      local_a0._24_8_ = uVar133;
      auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x908);
      local_5c0 = vbroadcastss_avx512vl(auVar74);
      auVar197 = ZEXT3264(local_5c0);
      local_5e0 = vpermps_avx512vl(auVar80,ZEXT1632(auVar74));
      auVar198 = ZEXT3264(local_5e0);
      local_c0 = vbroadcastsd_avx512vl(auVar77);
      auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar190);
      auVar195 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar80,ZEXT1632(auVar190));
      auVar194 = ZEXT3264(local_620);
      _local_e0 = vbroadcastsd_avx512vl(auVar76);
      auVar80 = vmulps_avx512vl(local_600,auVar96);
      auVar81 = vmulps_avx512vl(local_620,auVar96);
      auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,local_5c0);
      auVar81 = vfmadd231ps_avx512vl(auVar81,auVar97,local_5e0);
      auVar73 = vfmadd231ps_fma(auVar80,auVar98,local_640);
      auVar82 = vfmadd231ps_avx512vl(auVar81,auVar98,local_660);
      auVar83 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar95,local_500);
      auVar80 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27);
      auVar81 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x484);
      auVar84 = vfmadd231ps_avx512vl(auVar82,auVar95,local_4e0);
      auVar82 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x908);
      auVar94 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0xd8c);
      auVar85 = vmulps_avx512vl(local_600,auVar94);
      auVar86 = vmulps_avx512vl(local_620,auVar94);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar82,local_5c0);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar82,local_5e0);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar81,local_640);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar81,local_660);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar80,local_500);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar80,local_4e0);
      auVar87 = vsubps_avx512vl(auVar85,auVar83);
      auVar88 = vsubps_avx512vl(auVar86,auVar84);
      auVar89 = vmulps_avx512vl(auVar84,auVar87);
      auVar90 = vmulps_avx512vl(auVar83,auVar88);
      auVar89 = vsubps_avx512vl(auVar89,auVar90);
      auVar90 = vmulps_avx512vl(_local_e0,auVar96);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar97,local_c0);
      auVar73 = vfmadd231ps_fma(auVar90,auVar98,local_a0);
      auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),auVar95,local_80);
      auVar91 = vmulps_avx512vl(_local_e0,auVar94);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar82,local_c0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar81,local_a0);
      auVar24 = vfmadd231ps_fma(auVar91,auVar80,local_80);
      auVar91 = vmulps_avx512vl(auVar88,auVar88);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,auVar87);
      auVar92 = vmaxps_avx512vl(auVar90,ZEXT1632(auVar24));
      auVar92 = vmulps_avx512vl(auVar92,auVar92);
      auVar91 = vmulps_avx512vl(auVar92,auVar91);
      auVar89 = vmulps_avx512vl(auVar89,auVar89);
      uVar133 = vcmpps_avx512vl(auVar89,auVar91,2);
      auVar73 = vblendps_avx(auVar72,auVar75,8);
      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar77 = vandps_avx512vl(auVar73,auVar76);
      auVar73 = vblendps_avx(auVar71,*pauVar3,8);
      auVar73 = vandps_avx512vl(auVar73,auVar76);
      auVar77 = vmaxps_avx(auVar77,auVar73);
      auVar73 = vblendps_avx(auVar74,*pauVar4,8);
      auVar78 = vandps_avx512vl(auVar73,auVar76);
      auVar73 = vblendps_avx(auVar190,auVar59,8);
      auVar73 = vandps_avx512vl(auVar73,auVar76);
      auVar73 = vmaxps_avx(auVar78,auVar73);
      auVar73 = vmaxps_avx(auVar77,auVar73);
      auVar77 = vmovshdup_avx(auVar73);
      auVar77 = vmaxss_avx(auVar77,auVar73);
      auVar73 = vshufpd_avx(auVar73,auVar73,1);
      auVar73 = vmaxss_avx(auVar73,auVar77);
      auVar89._0_4_ = (float)iVar9;
      local_440._4_12_ = auVar72._4_12_;
      local_440._0_4_ = auVar89._0_4_;
      local_440._16_16_ = auVar93._16_16_;
      auVar89._4_4_ = auVar89._0_4_;
      auVar89._8_4_ = auVar89._0_4_;
      auVar89._12_4_ = auVar89._0_4_;
      auVar89._16_4_ = auVar89._0_4_;
      auVar89._20_4_ = auVar89._0_4_;
      auVar89._24_4_ = auVar89._0_4_;
      auVar89._28_4_ = auVar89._0_4_;
      uVar26 = vcmpps_avx512vl(auVar89,_DAT_01faff40,0xe);
      bVar68 = (byte)uVar133 & (byte)uVar26;
      auVar73 = vmulss_avx512f(auVar73,ZEXT416(0x35000000));
      auVar93._8_4_ = 2;
      auVar93._0_8_ = 0x200000002;
      auVar93._12_4_ = 2;
      auVar93._16_4_ = 2;
      auVar93._20_4_ = 2;
      auVar93._24_4_ = 2;
      auVar93._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar93,ZEXT1632(auVar72));
      local_120 = vpermps_avx512vl(auVar93,ZEXT1632(auVar71));
      local_140 = vpermps_avx512vl(auVar93,ZEXT1632(auVar74));
      local_5a0 = vpermps_avx2(auVar93,ZEXT1632(auVar190));
      uVar176 = *(uint *)(ray + k * 4 + 0x60);
      auVar77 = local_100._0_16_;
      if (bVar68 == 0) {
        bVar64 = false;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar189 = ZEXT3264(auVar93);
        auVar77 = vxorps_avx512vl(auVar77,auVar77);
        auVar191 = ZEXT1664(auVar77);
        auVar192 = ZEXT3264(local_500);
        auVar193 = ZEXT3264(local_4e0);
        auVar188 = ZEXT3264(local_640);
        auVar187 = ZEXT3264(local_660);
      }
      else {
        local_520._0_16_ = ZEXT416(uVar176);
        local_480._0_16_ = auVar73;
        auVar93 = vmulps_avx512vl(local_5a0,auVar94);
        auVar93 = vfmadd213ps_avx512vl(auVar82,local_140,auVar93);
        auVar93 = vfmadd213ps_avx512vl(auVar81,local_120,auVar93);
        auVar80 = vfmadd213ps_avx512vl(auVar80,local_100,auVar93);
        auVar93 = vmulps_avx512vl(local_5a0,auVar96);
        auVar93 = vfmadd213ps_avx512vl(auVar97,local_140,auVar93);
        auVar81 = vfmadd213ps_avx512vl(auVar98,local_120,auVar93);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1694);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar27 + 0x1f9c);
        auVar94 = vfmadd213ps_avx512vl(auVar95,local_100,auVar81);
        auVar95 = vmulps_avx512vl(local_600,auVar96);
        auVar81 = vmulps_avx512vl(local_620,auVar96);
        auVar96 = vmulps_avx512vl(local_5a0,auVar96);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,local_5c0);
        auVar81 = vfmadd231ps_avx512vl(auVar81,auVar97,local_5e0);
        auVar97 = vfmadd231ps_avx512vl(auVar96,local_140,auVar97);
        auVar190 = vfmadd231ps_fma(auVar95,auVar98,local_640);
        auVar95 = vfmadd231ps_avx512vl(auVar81,auVar98,local_660);
        auVar96 = vfmadd231ps_avx512vl(auVar97,local_120,auVar98);
        auVar81 = vfmadd231ps_avx512vl(ZEXT1632(auVar190),auVar93,local_500);
        auVar82 = vfmadd231ps_avx512vl(auVar95,auVar93,local_4e0);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1f9c);
        auVar96 = vfmadd231ps_avx512vl(auVar96,local_100,auVar93);
        auVar93 = vmulps_avx512vl(local_600,auVar97);
        auVar91 = vmulps_avx512vl(local_620,auVar97);
        auVar97 = vmulps_avx512vl(local_5a0,auVar97);
        auVar196 = ZEXT1664(auVar73);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar98,local_5c0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_5e0);
        auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
        auVar93 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar27 + 0x1694);
        auVar190 = vfmadd231ps_fma(auVar92,auVar93,local_640);
        auVar97 = vfmadd231ps_avx512vl(auVar91,auVar93,local_660);
        auVar93 = vfmadd231ps_avx512vl(auVar98,local_120,auVar93);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar190),auVar95,local_500);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_4e0);
        auVar91 = vfmadd231ps_avx512vl(auVar93,local_100,auVar95);
        auVar185._8_4_ = 0x7fffffff;
        auVar185._0_8_ = 0x7fffffff7fffffff;
        auVar185._12_4_ = 0x7fffffff;
        auVar185._16_4_ = 0x7fffffff;
        auVar185._20_4_ = 0x7fffffff;
        auVar185._24_4_ = 0x7fffffff;
        auVar185._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar81,auVar185);
        auVar95 = vandps_avx(auVar82,auVar185);
        auVar95 = vmaxps_avx(auVar93,auVar95);
        auVar93 = vandps_avx(auVar96,auVar185);
        auVar93 = vmaxps_avx(auVar95,auVar93);
        auVar96 = vbroadcastss_avx512vl(auVar73);
        uVar62 = vcmpps_avx512vl(auVar93,auVar96,1);
        bVar64 = (bool)((byte)uVar62 & 1);
        auVar92._0_4_ = (float)((uint)bVar64 * auVar87._0_4_ | (uint)!bVar64 * auVar81._0_4_);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar92._4_4_ = (float)((uint)bVar64 * auVar87._4_4_ | (uint)!bVar64 * auVar81._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar92._8_4_ = (float)((uint)bVar64 * auVar87._8_4_ | (uint)!bVar64 * auVar81._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar92._12_4_ = (float)((uint)bVar64 * auVar87._12_4_ | (uint)!bVar64 * auVar81._12_4_);
        bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar92._16_4_ = (float)((uint)bVar64 * auVar87._16_4_ | (uint)!bVar64 * auVar81._16_4_);
        bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar92._20_4_ = (float)((uint)bVar64 * auVar87._20_4_ | (uint)!bVar64 * auVar81._20_4_);
        bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar92._24_4_ = (float)((uint)bVar64 * auVar87._24_4_ | (uint)!bVar64 * auVar81._24_4_);
        bVar64 = SUB81(uVar62 >> 7,0);
        auVar92._28_4_ = (uint)bVar64 * auVar87._28_4_ | (uint)!bVar64 * auVar81._28_4_;
        bVar64 = (bool)((byte)uVar62 & 1);
        auVar99._0_4_ = (float)((uint)bVar64 * auVar88._0_4_ | (uint)!bVar64 * auVar82._0_4_);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar64 * auVar88._4_4_ | (uint)!bVar64 * auVar82._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar64 * auVar88._8_4_ | (uint)!bVar64 * auVar82._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar64 * auVar88._12_4_ | (uint)!bVar64 * auVar82._12_4_);
        bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar64 * auVar88._16_4_ | (uint)!bVar64 * auVar82._16_4_);
        bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar64 * auVar88._20_4_ | (uint)!bVar64 * auVar82._20_4_);
        bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar64 * auVar88._24_4_ | (uint)!bVar64 * auVar82._24_4_);
        bVar64 = SUB81(uVar62 >> 7,0);
        auVar99._28_4_ = (uint)bVar64 * auVar88._28_4_ | (uint)!bVar64 * auVar82._28_4_;
        auVar93 = vandps_avx(auVar185,auVar98);
        auVar95 = vandps_avx(auVar97,auVar185);
        auVar95 = vmaxps_avx(auVar93,auVar95);
        auVar93 = vandps_avx(auVar91,auVar185);
        auVar93 = vmaxps_avx(auVar95,auVar93);
        uVar62 = vcmpps_avx512vl(auVar93,auVar96,1);
        bVar64 = (bool)((byte)uVar62 & 1);
        auVar91._0_4_ = (float)((uint)bVar64 * auVar87._0_4_ | (uint)!bVar64 * auVar98._0_4_);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar91._4_4_ = (float)((uint)bVar64 * auVar87._4_4_ | (uint)!bVar64 * auVar98._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar91._8_4_ = (float)((uint)bVar64 * auVar87._8_4_ | (uint)!bVar64 * auVar98._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar91._12_4_ = (float)((uint)bVar64 * auVar87._12_4_ | (uint)!bVar64 * auVar98._12_4_);
        bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar91._16_4_ = (float)((uint)bVar64 * auVar87._16_4_ | (uint)!bVar64 * auVar98._16_4_);
        bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar91._20_4_ = (float)((uint)bVar64 * auVar87._20_4_ | (uint)!bVar64 * auVar98._20_4_);
        bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar91._24_4_ = (float)((uint)bVar64 * auVar87._24_4_ | (uint)!bVar64 * auVar98._24_4_);
        bVar64 = SUB81(uVar62 >> 7,0);
        auVar91._28_4_ = (uint)bVar64 * auVar87._28_4_ | (uint)!bVar64 * auVar98._28_4_;
        bVar64 = (bool)((byte)uVar62 & 1);
        auVar87._0_4_ = (float)((uint)bVar64 * auVar88._0_4_ | (uint)!bVar64 * auVar97._0_4_);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar87._4_4_ = (float)((uint)bVar64 * auVar88._4_4_ | (uint)!bVar64 * auVar97._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar87._8_4_ = (float)((uint)bVar64 * auVar88._8_4_ | (uint)!bVar64 * auVar97._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar87._12_4_ = (float)((uint)bVar64 * auVar88._12_4_ | (uint)!bVar64 * auVar97._12_4_);
        bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar87._16_4_ = (float)((uint)bVar64 * auVar88._16_4_ | (uint)!bVar64 * auVar97._16_4_);
        bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar87._20_4_ = (float)((uint)bVar64 * auVar88._20_4_ | (uint)!bVar64 * auVar97._20_4_);
        bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar87._24_4_ = (float)((uint)bVar64 * auVar88._24_4_ | (uint)!bVar64 * auVar97._24_4_);
        bVar64 = SUB81(uVar62 >> 7,0);
        auVar87._28_4_ = (uint)bVar64 * auVar88._28_4_ | (uint)!bVar64 * auVar97._28_4_;
        auVar79 = vxorps_avx512vl(auVar77,auVar77);
        auVar191 = ZEXT1664(auVar79);
        auVar93 = vfmadd213ps_avx512vl(auVar92,auVar92,ZEXT1632(auVar79));
        auVar77 = vfmadd231ps_fma(auVar93,auVar99,auVar99);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar142 = auVar93._0_4_;
        fVar130 = auVar93._4_4_;
        fVar131 = auVar93._8_4_;
        fVar132 = auVar93._12_4_;
        fVar165 = auVar93._16_4_;
        fVar169 = auVar93._20_4_;
        fVar69 = auVar93._24_4_;
        auVar95._4_4_ = fVar130 * fVar130 * fVar130 * auVar77._4_4_ * -0.5;
        auVar95._0_4_ = fVar142 * fVar142 * fVar142 * auVar77._0_4_ * -0.5;
        auVar95._8_4_ = fVar131 * fVar131 * fVar131 * auVar77._8_4_ * -0.5;
        auVar95._12_4_ = fVar132 * fVar132 * fVar132 * auVar77._12_4_ * -0.5;
        auVar95._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar95._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar95._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
        auVar95._28_4_ = 0;
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar81,auVar93);
        auVar98._4_4_ = auVar99._4_4_ * auVar95._4_4_;
        auVar98._0_4_ = auVar99._0_4_ * auVar95._0_4_;
        auVar98._8_4_ = auVar99._8_4_ * auVar95._8_4_;
        auVar98._12_4_ = auVar99._12_4_ * auVar95._12_4_;
        auVar98._16_4_ = auVar99._16_4_ * auVar95._16_4_;
        auVar98._20_4_ = auVar99._20_4_ * auVar95._20_4_;
        auVar98._24_4_ = auVar99._24_4_ * auVar95._24_4_;
        auVar98._28_4_ = auVar93._28_4_;
        auVar97._4_4_ = auVar95._4_4_ * -auVar92._4_4_;
        auVar97._0_4_ = auVar95._0_4_ * -auVar92._0_4_;
        auVar97._8_4_ = auVar95._8_4_ * -auVar92._8_4_;
        auVar97._12_4_ = auVar95._12_4_ * -auVar92._12_4_;
        auVar97._16_4_ = auVar95._16_4_ * -auVar92._16_4_;
        auVar97._20_4_ = auVar95._20_4_ * -auVar92._20_4_;
        auVar97._24_4_ = auVar95._24_4_ * -auVar92._24_4_;
        auVar97._28_4_ = auVar92._28_4_ ^ 0x80000000;
        auVar93 = vmulps_avx512vl(auVar95,ZEXT1632(auVar79));
        auVar88 = ZEXT1632(auVar79);
        auVar96 = vfmadd213ps_avx512vl(auVar91,auVar91,auVar88);
        auVar77 = vfmadd231ps_fma(auVar96,auVar87,auVar87);
        auVar82 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar142 = auVar82._0_4_;
        fVar130 = auVar82._4_4_;
        fVar131 = auVar82._8_4_;
        fVar132 = auVar82._12_4_;
        fVar165 = auVar82._16_4_;
        fVar169 = auVar82._20_4_;
        fVar69 = auVar82._24_4_;
        auVar96._4_4_ = fVar130 * fVar130 * fVar130 * auVar77._4_4_ * -0.5;
        auVar96._0_4_ = fVar142 * fVar142 * fVar142 * auVar77._0_4_ * -0.5;
        auVar96._8_4_ = fVar131 * fVar131 * fVar131 * auVar77._8_4_ * -0.5;
        auVar96._12_4_ = fVar132 * fVar132 * fVar132 * auVar77._12_4_ * -0.5;
        auVar96._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar96._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
        auVar96._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
        auVar96._28_4_ = 0;
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar81,auVar82);
        auVar81._4_4_ = auVar87._4_4_ * auVar96._4_4_;
        auVar81._0_4_ = auVar87._0_4_ * auVar96._0_4_;
        auVar81._8_4_ = auVar87._8_4_ * auVar96._8_4_;
        auVar81._12_4_ = auVar87._12_4_ * auVar96._12_4_;
        auVar81._16_4_ = auVar87._16_4_ * auVar96._16_4_;
        auVar81._20_4_ = auVar87._20_4_ * auVar96._20_4_;
        auVar81._24_4_ = auVar87._24_4_ * auVar96._24_4_;
        auVar81._28_4_ = auVar82._28_4_;
        auVar82._4_4_ = -auVar91._4_4_ * auVar96._4_4_;
        auVar82._0_4_ = -auVar91._0_4_ * auVar96._0_4_;
        auVar82._8_4_ = -auVar91._8_4_ * auVar96._8_4_;
        auVar82._12_4_ = -auVar91._12_4_ * auVar96._12_4_;
        auVar82._16_4_ = -auVar91._16_4_ * auVar96._16_4_;
        auVar82._20_4_ = -auVar91._20_4_ * auVar96._20_4_;
        auVar82._24_4_ = -auVar91._24_4_ * auVar96._24_4_;
        auVar82._28_4_ = auVar95._28_4_;
        auVar95 = vmulps_avx512vl(auVar96,auVar88);
        auVar77 = vfmadd213ps_fma(auVar98,auVar90,auVar83);
        auVar190 = vfmadd213ps_fma(auVar97,auVar90,auVar84);
        auVar96 = vfmadd213ps_avx512vl(auVar93,auVar90,auVar94);
        auVar87 = vfmadd213ps_avx512vl(auVar81,ZEXT1632(auVar24),auVar85);
        auVar78 = vfnmadd213ps_fma(auVar98,auVar90,auVar83);
        auVar83 = ZEXT1632(auVar24);
        auVar76 = vfmadd213ps_fma(auVar82,auVar83,auVar86);
        auVar126 = vfnmadd213ps_fma(auVar97,auVar90,auVar84);
        auVar74 = vfmadd213ps_fma(auVar95,auVar83,auVar80);
        auVar98 = vfnmadd231ps_avx512vl(auVar94,auVar90,auVar93);
        auVar127 = vfnmadd213ps_fma(auVar81,auVar83,auVar85);
        auVar134 = vfnmadd213ps_fma(auVar82,auVar83,auVar86);
        auVar135 = vfnmadd231ps_fma(auVar80,ZEXT1632(auVar24),auVar95);
        auVar95 = vsubps_avx512vl(auVar87,ZEXT1632(auVar78));
        auVar93 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar126));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar74),auVar98);
        auVar80 = vmulps_avx512vl(auVar93,auVar98);
        auVar72 = vfmsub231ps_fma(auVar80,ZEXT1632(auVar126),auVar97);
        auVar94._4_4_ = auVar78._4_4_ * auVar97._4_4_;
        auVar94._0_4_ = auVar78._0_4_ * auVar97._0_4_;
        auVar94._8_4_ = auVar78._8_4_ * auVar97._8_4_;
        auVar94._12_4_ = auVar78._12_4_ * auVar97._12_4_;
        auVar94._16_4_ = auVar97._16_4_ * 0.0;
        auVar94._20_4_ = auVar97._20_4_ * 0.0;
        auVar94._24_4_ = auVar97._24_4_ * 0.0;
        auVar94._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar94,auVar98,auVar95);
        auVar83._4_4_ = auVar126._4_4_ * auVar95._4_4_;
        auVar83._0_4_ = auVar126._0_4_ * auVar95._0_4_;
        auVar83._8_4_ = auVar126._8_4_ * auVar95._8_4_;
        auVar83._12_4_ = auVar126._12_4_ * auVar95._12_4_;
        auVar83._16_4_ = auVar95._16_4_ * 0.0;
        auVar83._20_4_ = auVar95._20_4_ * 0.0;
        auVar83._24_4_ = auVar95._24_4_ * 0.0;
        auVar83._28_4_ = auVar95._28_4_;
        auVar71 = vfmsub231ps_fma(auVar83,ZEXT1632(auVar78),auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar88,auVar97);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar72));
        auVar91 = ZEXT1632(auVar79);
        uVar62 = vcmpps_avx512vl(auVar93,auVar91,2);
        bVar61 = (byte)uVar62;
        fVar69 = (float)((uint)(bVar61 & 1) * auVar77._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar127._0_4_);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar116 = (float)((uint)bVar64 * auVar77._4_4_ | (uint)!bVar64 * auVar127._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar118 = (float)((uint)bVar64 * auVar77._8_4_ | (uint)!bVar64 * auVar127._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar121 = (float)((uint)bVar64 * auVar77._12_4_ | (uint)!bVar64 * auVar127._12_4_);
        auVar81 = ZEXT1632(CONCAT412(fVar121,CONCAT48(fVar118,CONCAT44(fVar116,fVar69))));
        fVar70 = (float)((uint)(bVar61 & 1) * auVar190._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar134._0_4_);
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar117 = (float)((uint)bVar64 * auVar190._4_4_ | (uint)!bVar64 * auVar134._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar119 = (float)((uint)bVar64 * auVar190._8_4_ | (uint)!bVar64 * auVar134._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar122 = (float)((uint)bVar64 * auVar190._12_4_ | (uint)!bVar64 * auVar134._12_4_);
        auVar82 = ZEXT1632(CONCAT412(fVar122,CONCAT48(fVar119,CONCAT44(fVar117,fVar70))));
        auVar88._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar135._0_4_
                    );
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar88._4_4_ = (float)((uint)bVar64 * auVar96._4_4_ | (uint)!bVar64 * auVar135._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar88._8_4_ = (float)((uint)bVar64 * auVar96._8_4_ | (uint)!bVar64 * auVar135._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar88._12_4_ = (float)((uint)bVar64 * auVar96._12_4_ | (uint)!bVar64 * auVar135._12_4_);
        fVar142 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar96._16_4_);
        auVar88._16_4_ = fVar142;
        fVar130 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar96._20_4_);
        auVar88._20_4_ = fVar130;
        fVar131 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar96._24_4_);
        auVar88._24_4_ = fVar131;
        iVar1 = (uint)(byte)(uVar62 >> 7) * auVar96._28_4_;
        auVar88._28_4_ = iVar1;
        auVar95 = vblendmps_avx512vl(ZEXT1632(auVar78),auVar87);
        auVar100._0_4_ =
             (uint)(bVar61 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar72._0_4_;
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar100._4_4_ = (uint)bVar64 * auVar95._4_4_ | (uint)!bVar64 * auVar72._4_4_;
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar100._8_4_ = (uint)bVar64 * auVar95._8_4_ | (uint)!bVar64 * auVar72._8_4_;
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar100._12_4_ = (uint)bVar64 * auVar95._12_4_ | (uint)!bVar64 * auVar72._12_4_;
        auVar100._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar95._16_4_;
        auVar100._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar95._20_4_;
        auVar100._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar95._24_4_;
        auVar100._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar95._28_4_;
        auVar95 = vblendmps_avx512vl(ZEXT1632(auVar126),ZEXT1632(auVar76));
        auVar101._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar190._0_4_
                    );
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar64 * auVar95._4_4_ | (uint)!bVar64 * auVar190._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar64 * auVar95._8_4_ | (uint)!bVar64 * auVar190._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar64 * auVar95._12_4_ | (uint)!bVar64 * auVar190._12_4_);
        fVar132 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar95._16_4_);
        auVar101._16_4_ = fVar132;
        fVar165 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar95._20_4_);
        auVar101._20_4_ = fVar165;
        fVar169 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar95._24_4_);
        auVar101._24_4_ = fVar169;
        auVar101._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar95._28_4_;
        auVar95 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar74));
        auVar102._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar96._0_4_)
        ;
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar64 * auVar95._4_4_ | (uint)!bVar64 * auVar96._4_4_);
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar64 * auVar95._8_4_ | (uint)!bVar64 * auVar96._8_4_);
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar64 * auVar95._12_4_ | (uint)!bVar64 * auVar96._12_4_);
        bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar64 * auVar95._16_4_ | (uint)!bVar64 * auVar96._16_4_);
        bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar64 * auVar95._20_4_ | (uint)!bVar64 * auVar96._20_4_);
        bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar64 * auVar95._24_4_ | (uint)!bVar64 * auVar96._24_4_);
        bVar64 = SUB81(uVar62 >> 7,0);
        auVar102._28_4_ = (uint)bVar64 * auVar95._28_4_ | (uint)!bVar64 * auVar96._28_4_;
        auVar103._0_4_ =
             (uint)(bVar61 & 1) * (int)auVar78._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar87._0_4_;
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar103._4_4_ = (uint)bVar64 * (int)auVar78._4_4_ | (uint)!bVar64 * auVar87._4_4_;
        bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar103._8_4_ = (uint)bVar64 * (int)auVar78._8_4_ | (uint)!bVar64 * auVar87._8_4_;
        bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar103._12_4_ = (uint)bVar64 * (int)auVar78._12_4_ | (uint)!bVar64 * auVar87._12_4_;
        auVar103._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar87._16_4_;
        auVar103._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar87._20_4_;
        auVar103._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar87._24_4_;
        auVar103._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar87._28_4_;
        bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar104._0_4_ =
             (uint)(bVar61 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar74._0_4_;
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar104._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar74._4_4_;
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar104._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar74._8_4_;
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar104._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar74._12_4_;
        auVar104._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_;
        auVar104._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_;
        auVar104._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_;
        iVar2 = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
        auVar104._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar103,auVar81);
        auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar126._12_4_ |
                                                (uint)!bVar14 * auVar76._12_4_,
                                                CONCAT48((uint)bVar13 * (int)auVar126._8_4_ |
                                                         (uint)!bVar13 * auVar76._8_4_,
                                                         CONCAT44((uint)bVar64 * (int)auVar126._4_4_
                                                                  | (uint)!bVar64 * auVar76._4_4_,
                                                                  (uint)(bVar61 & 1) *
                                                                  (int)auVar126._0_4_ |
                                                                  (uint)!(bool)(bVar61 & 1) *
                                                                  auVar76._0_4_)))),auVar82);
        auVar98 = vsubps_avx(auVar104,auVar88);
        auVar97 = vsubps_avx(auVar81,auVar100);
        auVar96 = vsubps_avx(auVar82,auVar101);
        auVar80 = vsubps_avx(auVar88,auVar102);
        auVar84._4_4_ = auVar98._4_4_ * fVar116;
        auVar84._0_4_ = auVar98._0_4_ * fVar69;
        auVar84._8_4_ = auVar98._8_4_ * fVar118;
        auVar84._12_4_ = auVar98._12_4_ * fVar121;
        auVar84._16_4_ = auVar98._16_4_ * 0.0;
        auVar84._20_4_ = auVar98._20_4_ * 0.0;
        auVar84._24_4_ = auVar98._24_4_ * 0.0;
        auVar84._28_4_ = iVar2;
        auVar77 = vfmsub231ps_fma(auVar84,auVar88,auVar94);
        auVar85._4_4_ = fVar117 * auVar94._4_4_;
        auVar85._0_4_ = fVar70 * auVar94._0_4_;
        auVar85._8_4_ = fVar119 * auVar94._8_4_;
        auVar85._12_4_ = fVar122 * auVar94._12_4_;
        auVar85._16_4_ = auVar94._16_4_ * 0.0;
        auVar85._20_4_ = auVar94._20_4_ * 0.0;
        auVar85._24_4_ = auVar94._24_4_ * 0.0;
        auVar85._28_4_ = auVar93._28_4_;
        auVar190 = vfmsub231ps_fma(auVar85,auVar81,auVar95);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar190),auVar91,ZEXT1632(auVar77));
        auVar154._0_4_ = auVar95._0_4_ * auVar88._0_4_;
        auVar154._4_4_ = auVar95._4_4_ * auVar88._4_4_;
        auVar154._8_4_ = auVar95._8_4_ * auVar88._8_4_;
        auVar154._12_4_ = auVar95._12_4_ * auVar88._12_4_;
        auVar154._16_4_ = auVar95._16_4_ * fVar142;
        auVar154._20_4_ = auVar95._20_4_ * fVar130;
        auVar154._24_4_ = auVar95._24_4_ * fVar131;
        auVar154._28_4_ = 0;
        auVar77 = vfmsub231ps_fma(auVar154,auVar82,auVar98);
        auVar83 = vfmadd231ps_avx512vl(auVar93,auVar91,ZEXT1632(auVar77));
        auVar93 = vmulps_avx512vl(auVar80,auVar100);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar97,auVar102);
        auVar86._4_4_ = auVar96._4_4_ * auVar102._4_4_;
        auVar86._0_4_ = auVar96._0_4_ * auVar102._0_4_;
        auVar86._8_4_ = auVar96._8_4_ * auVar102._8_4_;
        auVar86._12_4_ = auVar96._12_4_ * auVar102._12_4_;
        auVar86._16_4_ = auVar96._16_4_ * auVar102._16_4_;
        auVar86._20_4_ = auVar96._20_4_ * auVar102._20_4_;
        auVar86._24_4_ = auVar96._24_4_ * auVar102._24_4_;
        auVar86._28_4_ = auVar102._28_4_;
        auVar77 = vfmsub231ps_fma(auVar86,auVar101,auVar80);
        auVar155._0_4_ = auVar101._0_4_ * auVar97._0_4_;
        auVar155._4_4_ = auVar101._4_4_ * auVar97._4_4_;
        auVar155._8_4_ = auVar101._8_4_ * auVar97._8_4_;
        auVar155._12_4_ = auVar101._12_4_ * auVar97._12_4_;
        auVar155._16_4_ = fVar132 * auVar97._16_4_;
        auVar155._20_4_ = fVar165 * auVar97._20_4_;
        auVar155._24_4_ = fVar169 * auVar97._24_4_;
        auVar155._28_4_ = 0;
        auVar190 = vfmsub231ps_fma(auVar155,auVar96,auVar100);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar190),auVar91,auVar93);
        auVar84 = vfmadd231ps_avx512vl(auVar93,auVar91,ZEXT1632(auVar77));
        auVar93 = vmaxps_avx(auVar83,auVar84);
        uVar133 = vcmpps_avx512vl(auVar93,auVar91,2);
        bVar68 = bVar68 & (byte)uVar133;
        auVar192 = ZEXT3264(local_500);
        auVar193 = ZEXT3264(local_4e0);
        auVar188 = ZEXT3264(local_640);
        auVar187 = ZEXT3264(local_660);
        if (bVar68 == 0) {
          bVar64 = false;
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar189 = ZEXT3264(auVar93);
          auVar197 = ZEXT3264(local_5c0);
          auVar198 = ZEXT3264(local_5e0);
          auVar195 = ZEXT3264(local_600);
          auVar194 = ZEXT3264(local_620);
        }
        else {
          uVar125 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar181._4_4_ = uVar125;
          auVar181._0_4_ = uVar125;
          auVar181._8_4_ = uVar125;
          auVar181._12_4_ = uVar125;
          auVar181._16_4_ = uVar125;
          auVar181._20_4_ = uVar125;
          auVar181._24_4_ = uVar125;
          auVar181._28_4_ = uVar125;
          auVar183 = ZEXT3264(auVar181);
          auVar33._4_4_ = auVar80._4_4_ * auVar95._4_4_;
          auVar33._0_4_ = auVar80._0_4_ * auVar95._0_4_;
          auVar33._8_4_ = auVar80._8_4_ * auVar95._8_4_;
          auVar33._12_4_ = auVar80._12_4_ * auVar95._12_4_;
          auVar33._16_4_ = auVar80._16_4_ * auVar95._16_4_;
          auVar33._20_4_ = auVar80._20_4_ * auVar95._20_4_;
          auVar33._24_4_ = auVar80._24_4_ * auVar95._24_4_;
          auVar33._28_4_ = auVar93._28_4_;
          auVar76 = vfmsub231ps_fma(auVar33,auVar96,auVar98);
          auVar34._4_4_ = auVar98._4_4_ * auVar97._4_4_;
          auVar34._0_4_ = auVar98._0_4_ * auVar97._0_4_;
          auVar34._8_4_ = auVar98._8_4_ * auVar97._8_4_;
          auVar34._12_4_ = auVar98._12_4_ * auVar97._12_4_;
          auVar34._16_4_ = auVar98._16_4_ * auVar97._16_4_;
          auVar34._20_4_ = auVar98._20_4_ * auVar97._20_4_;
          auVar34._24_4_ = auVar98._24_4_ * auVar97._24_4_;
          auVar34._28_4_ = auVar98._28_4_;
          auVar190 = vfmsub231ps_fma(auVar34,auVar94,auVar80);
          auVar35._4_4_ = auVar96._4_4_ * auVar94._4_4_;
          auVar35._0_4_ = auVar96._0_4_ * auVar94._0_4_;
          auVar35._8_4_ = auVar96._8_4_ * auVar94._8_4_;
          auVar35._12_4_ = auVar96._12_4_ * auVar94._12_4_;
          auVar35._16_4_ = auVar96._16_4_ * auVar94._16_4_;
          auVar35._20_4_ = auVar96._20_4_ * auVar94._20_4_;
          auVar35._24_4_ = auVar96._24_4_ * auVar94._24_4_;
          auVar35._28_4_ = auVar96._28_4_;
          auVar74 = vfmsub231ps_fma(auVar35,auVar97,auVar95);
          auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar190),ZEXT1632(auVar74));
          auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar76),auVar91);
          auVar95 = vrcp14ps_avx512vl(auVar93);
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar189 = ZEXT3264(auVar98);
          auVar97 = vfnmadd213ps_avx512vl(auVar95,auVar93,auVar98);
          auVar77 = vfmadd132ps_fma(auVar97,auVar95,auVar95);
          auVar36._4_4_ = auVar74._4_4_ * auVar88._4_4_;
          auVar36._0_4_ = auVar74._0_4_ * auVar88._0_4_;
          auVar36._8_4_ = auVar74._8_4_ * auVar88._8_4_;
          auVar36._12_4_ = auVar74._12_4_ * auVar88._12_4_;
          auVar36._16_4_ = fVar142 * 0.0;
          auVar36._20_4_ = fVar130 * 0.0;
          auVar36._24_4_ = fVar131 * 0.0;
          auVar36._28_4_ = iVar1;
          auVar190 = vfmadd231ps_fma(auVar36,auVar82,ZEXT1632(auVar190));
          auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar81,ZEXT1632(auVar76));
          fVar142 = auVar77._0_4_;
          fVar130 = auVar77._4_4_;
          fVar131 = auVar77._8_4_;
          fVar132 = auVar77._12_4_;
          local_380 = ZEXT1632(CONCAT412(auVar190._12_4_ * fVar132,
                                         CONCAT48(auVar190._8_4_ * fVar131,
                                                  CONCAT44(auVar190._4_4_ * fVar130,
                                                           auVar190._0_4_ * fVar142))));
          auVar172._4_4_ = uVar176;
          auVar172._0_4_ = uVar176;
          auVar172._8_4_ = uVar176;
          auVar172._12_4_ = uVar176;
          auVar172._16_4_ = uVar176;
          auVar172._20_4_ = uVar176;
          auVar172._24_4_ = uVar176;
          auVar172._28_4_ = uVar176;
          uVar133 = vcmpps_avx512vl(local_380,auVar181,2);
          uVar26 = vcmpps_avx512vl(auVar172,local_380,2);
          bVar68 = (byte)uVar133 & (byte)uVar26 & bVar68;
          auVar197 = ZEXT3264(local_5c0);
          auVar198 = ZEXT3264(local_5e0);
          auVar195 = ZEXT3264(local_600);
          auVar194 = ZEXT3264(local_620);
          if (bVar68 != 0) {
            uVar133 = vcmpps_avx512vl(auVar93,auVar91,4);
            bVar68 = bVar68 & (byte)uVar133;
            if (bVar68 != 0) {
              fVar165 = auVar83._0_4_ * fVar142;
              fVar169 = auVar83._4_4_ * fVar130;
              auVar37._4_4_ = fVar169;
              auVar37._0_4_ = fVar165;
              fVar69 = auVar83._8_4_ * fVar131;
              auVar37._8_4_ = fVar69;
              fVar70 = auVar83._12_4_ * fVar132;
              auVar37._12_4_ = fVar70;
              fVar116 = auVar83._16_4_ * 0.0;
              auVar37._16_4_ = fVar116;
              fVar117 = auVar83._20_4_ * 0.0;
              auVar37._20_4_ = fVar117;
              fVar118 = auVar83._24_4_ * 0.0;
              auVar37._24_4_ = fVar118;
              auVar37._28_4_ = auVar93._28_4_;
              auVar95 = vsubps_avx512vl(auVar98,auVar37);
              local_3c0._0_4_ =
                   (float)((uint)(bVar61 & 1) * (int)fVar165 |
                          (uint)!(bool)(bVar61 & 1) * auVar95._0_4_);
              bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
              local_3c0._4_4_ = (float)((uint)bVar64 * (int)fVar169 | (uint)!bVar64 * auVar95._4_4_)
              ;
              bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
              local_3c0._8_4_ = (float)((uint)bVar64 * (int)fVar69 | (uint)!bVar64 * auVar95._8_4_);
              bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
              local_3c0._12_4_ =
                   (float)((uint)bVar64 * (int)fVar70 | (uint)!bVar64 * auVar95._12_4_);
              bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
              local_3c0._16_4_ =
                   (float)((uint)bVar64 * (int)fVar116 | (uint)!bVar64 * auVar95._16_4_);
              bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
              local_3c0._20_4_ =
                   (float)((uint)bVar64 * (int)fVar117 | (uint)!bVar64 * auVar95._20_4_);
              bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
              local_3c0._24_4_ =
                   (float)((uint)bVar64 * (int)fVar118 | (uint)!bVar64 * auVar95._24_4_);
              bVar64 = SUB81(uVar62 >> 7,0);
              local_3c0._28_4_ =
                   (float)((uint)bVar64 * auVar93._28_4_ | (uint)!bVar64 * auVar95._28_4_);
              auVar93 = vsubps_avx(ZEXT1632(auVar24),auVar90);
              auVar77 = vfmadd213ps_fma(auVar93,local_3c0,auVar90);
              uVar125 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar90._4_4_ = uVar125;
              auVar90._0_4_ = uVar125;
              auVar90._8_4_ = uVar125;
              auVar90._12_4_ = uVar125;
              auVar90._16_4_ = uVar125;
              auVar90._20_4_ = uVar125;
              auVar90._24_4_ = uVar125;
              auVar90._28_4_ = uVar125;
              auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                           CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                    CONCAT44(auVar77._4_4_ +
                                                                             auVar77._4_4_,
                                                                             auVar77._0_4_ +
                                                                             auVar77._0_4_)))),
                                        auVar90);
              uVar133 = vcmpps_avx512vl(local_380,auVar93,6);
              if (((byte)uVar133 & bVar68) != 0) {
                auVar141._0_4_ = auVar84._0_4_ * fVar142;
                auVar141._4_4_ = auVar84._4_4_ * fVar130;
                auVar141._8_4_ = auVar84._8_4_ * fVar131;
                auVar141._12_4_ = auVar84._12_4_ * fVar132;
                auVar141._16_4_ = auVar84._16_4_ * 0.0;
                auVar141._20_4_ = auVar84._20_4_ * 0.0;
                auVar141._24_4_ = auVar84._24_4_ * 0.0;
                auVar141._28_4_ = 0;
                auVar93 = vsubps_avx512vl(auVar98,auVar141);
                auVar105._0_4_ =
                     (uint)(bVar61 & 1) * (int)auVar141._0_4_ |
                     (uint)!(bool)(bVar61 & 1) * auVar93._0_4_;
                bVar64 = (bool)((byte)(uVar62 >> 1) & 1);
                auVar105._4_4_ = (uint)bVar64 * (int)auVar141._4_4_ | (uint)!bVar64 * auVar93._4_4_;
                bVar64 = (bool)((byte)(uVar62 >> 2) & 1);
                auVar105._8_4_ = (uint)bVar64 * (int)auVar141._8_4_ | (uint)!bVar64 * auVar93._8_4_;
                bVar64 = (bool)((byte)(uVar62 >> 3) & 1);
                auVar105._12_4_ =
                     (uint)bVar64 * (int)auVar141._12_4_ | (uint)!bVar64 * auVar93._12_4_;
                bVar64 = (bool)((byte)(uVar62 >> 4) & 1);
                auVar105._16_4_ =
                     (uint)bVar64 * (int)auVar141._16_4_ | (uint)!bVar64 * auVar93._16_4_;
                bVar64 = (bool)((byte)(uVar62 >> 5) & 1);
                auVar105._20_4_ =
                     (uint)bVar64 * (int)auVar141._20_4_ | (uint)!bVar64 * auVar93._20_4_;
                bVar64 = (bool)((byte)(uVar62 >> 6) & 1);
                auVar105._24_4_ =
                     (uint)bVar64 * (int)auVar141._24_4_ | (uint)!bVar64 * auVar93._24_4_;
                auVar105._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar93._28_4_;
                auVar30._8_4_ = 0x40000000;
                auVar30._0_8_ = 0x4000000040000000;
                auVar30._12_4_ = 0x40000000;
                auVar30._16_4_ = 0x40000000;
                auVar30._20_4_ = 0x40000000;
                auVar30._24_4_ = 0x40000000;
                auVar30._28_4_ = 0x40000000;
                local_3a0 = vfmsub132ps_avx512vl(auVar105,auVar98,auVar30);
                local_360 = 0;
                if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar64 = true, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar142 = 1.0 / auVar89._0_4_;
                    local_300[0] = fVar142 * (local_3c0._0_4_ + 0.0);
                    local_300[1] = fVar142 * (local_3c0._4_4_ + 1.0);
                    local_300[2] = fVar142 * (local_3c0._8_4_ + 2.0);
                    local_300[3] = fVar142 * (local_3c0._12_4_ + 3.0);
                    fStack_2f0 = fVar142 * (local_3c0._16_4_ + 4.0);
                    fStack_2ec = fVar142 * (local_3c0._20_4_ + 5.0);
                    fStack_2e8 = fVar142 * (local_3c0._24_4_ + 6.0);
                    fStack_2e4 = local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    local_400 = 0;
                    uVar63 = (ulong)((byte)uVar133 & bVar68);
                    for (uVar62 = uVar63; (uVar62 & 1) == 0;
                        uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                      local_400 = local_400 + 1;
                    }
                    local_4a0 = vpbroadcastd_avx512vl();
                    local_4c0 = vpbroadcastd_avx512vl();
                    local_540 = auVar181;
                    local_35c = iVar9;
                    local_350 = auVar75;
                    local_340 = uVar25;
                    uStack_338 = uVar56;
                    local_330 = uVar57;
                    uStack_328 = uVar58;
                    do {
                      auVar76 = auVar191._0_16_;
                      local_460 = (uint)uVar63;
                      uStack_45c = (uint)(uVar63 >> 0x20);
                      fVar142 = local_300[local_400];
                      auVar136._4_4_ = fVar142;
                      auVar136._0_4_ = fVar142;
                      auVar136._8_4_ = fVar142;
                      auVar136._12_4_ = fVar142;
                      local_200._16_4_ = fVar142;
                      local_200._0_16_ = auVar136;
                      local_200._20_4_ = fVar142;
                      local_200._24_4_ = fVar142;
                      local_200._28_4_ = fVar142;
                      local_1e0 = *(undefined4 *)(local_2e0 + local_400 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_2c0 + local_400 * 4);
                      local_690.context = context->user;
                      fVar130 = 1.0 - fVar142;
                      auVar24 = vfnmadd231ss_fma(ZEXT416((uint)(fVar142 * (fVar130 + fVar130))),
                                                 ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
                      auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar136,
                                                ZEXT416(0xc0a00000));
                      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142 * 3.0)),
                                                ZEXT416((uint)(fVar142 + fVar142)),auVar73);
                      auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar136,
                                                ZEXT416(0x40000000));
                      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130 * -3.0)),
                                                ZEXT416((uint)(fVar130 + fVar130)),auVar73);
                      auVar190 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar136,
                                                 ZEXT416((uint)(fVar130 * -2.0)));
                      fVar142 = auVar24._0_4_ * 0.5;
                      fVar130 = auVar77._0_4_ * 0.5;
                      fVar131 = auVar73._0_4_ * 0.5;
                      fVar132 = auVar190._0_4_ * 0.5;
                      auVar147._0_4_ = fVar132 * local_560;
                      auVar147._4_4_ = fVar132 * fStack_55c;
                      auVar147._8_4_ = fVar132 * fStack_558;
                      auVar147._12_4_ = fVar132 * fStack_554;
                      auVar161._4_4_ = fVar131;
                      auVar161._0_4_ = fVar131;
                      auVar161._8_4_ = fVar131;
                      auVar161._12_4_ = fVar131;
                      auVar73 = vfmadd132ps_fma(auVar161,auVar147,auVar20);
                      auVar148._4_4_ = fVar130;
                      auVar148._0_4_ = fVar130;
                      auVar148._8_4_ = fVar130;
                      auVar148._12_4_ = fVar130;
                      auVar73 = vfmadd132ps_fma(auVar148,auVar73,auVar21);
                      auVar128._4_4_ = fVar142;
                      auVar128._0_4_ = fVar142;
                      auVar128._8_4_ = fVar142;
                      auVar128._12_4_ = fVar142;
                      auVar73 = vfmadd213ps_fma(auVar128,auVar75,auVar73);
                      local_260 = auVar73._0_4_;
                      auVar156._8_4_ = 1;
                      auVar156._0_8_ = 0x100000001;
                      auVar156._12_4_ = 1;
                      auVar156._16_4_ = 1;
                      auVar156._20_4_ = 1;
                      auVar156._24_4_ = 1;
                      auVar156._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar156,ZEXT1632(auVar73));
                      auVar163._8_4_ = 2;
                      auVar163._0_8_ = 0x200000002;
                      auVar163._12_4_ = 2;
                      auVar163._16_4_ = 2;
                      auVar163._20_4_ = 2;
                      auVar163._24_4_ = 2;
                      auVar163._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar163,ZEXT1632(auVar73));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_4c0._0_8_;
                      uStack_1b8 = local_4c0._8_8_;
                      uStack_1b0 = local_4c0._16_8_;
                      uStack_1a8 = local_4c0._24_8_;
                      local_1a0 = local_4a0;
                      vpcmpeqd_avx2(local_4a0,local_4a0);
                      local_180 = (local_690.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_690.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_580 = local_280;
                      local_690.valid = (int *)local_580;
                      local_690.geometryUserPtr = pGVar10->userPtr;
                      local_690.hit = (RTCHitN *)&local_260;
                      local_690.N = 8;
                      local_690.ray = (RTCRayN *)ray;
                      if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar10->occlusionFilterN)(&local_690);
                        auVar183 = ZEXT3264(local_540);
                        auVar196 = ZEXT1664(local_480._0_16_);
                        auVar194 = ZEXT3264(local_620);
                        auVar195 = ZEXT3264(local_600);
                        auVar198 = ZEXT3264(local_5e0);
                        auVar197 = ZEXT3264(local_5c0);
                        auVar187 = ZEXT3264(local_660);
                        auVar188 = ZEXT3264(local_640);
                        auVar193 = ZEXT3264(local_4e0);
                        auVar192 = ZEXT3264(local_500);
                        auVar73 = vxorps_avx512vl(auVar76,auVar76);
                        auVar191 = ZEXT1664(auVar73);
                        uVar176 = local_520._0_4_;
                      }
                      auVar73 = auVar191._0_16_;
                      if (local_580 == (undefined1  [32])0x0) {
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar189 = ZEXT3264(auVar93);
                        uVar63 = CONCAT44(uStack_45c,local_460);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar189 = ZEXT3264(auVar93);
                        }
                        else {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar189 = ZEXT3264(auVar93);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_690);
                            auVar183 = ZEXT3264(local_540);
                            auVar196 = ZEXT1664(local_480._0_16_);
                            auVar194 = ZEXT3264(local_620);
                            auVar195 = ZEXT3264(local_600);
                            auVar198 = ZEXT3264(local_5e0);
                            auVar197 = ZEXT3264(local_5c0);
                            auVar187 = ZEXT3264(local_660);
                            auVar188 = ZEXT3264(local_640);
                            auVar193 = ZEXT3264(local_4e0);
                            auVar192 = ZEXT3264(local_500);
                            auVar73 = vxorps_avx512vl(auVar73,auVar73);
                            auVar191 = ZEXT1664(auVar73);
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar189 = ZEXT3264(auVar93);
                            uVar176 = local_520._0_4_;
                          }
                        }
                        auVar73 = auVar196._0_16_;
                        uVar62 = vptestmd_avx512vl(local_580,local_580);
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar64 = (bool)((byte)uVar62 & 1);
                        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
                        bVar14 = (bool)((byte)(uVar62 >> 3) & 1);
                        bVar15 = (bool)((byte)(uVar62 >> 4) & 1);
                        bVar16 = (bool)((byte)(uVar62 >> 5) & 1);
                        bVar17 = (bool)((byte)(uVar62 >> 6) & 1);
                        bVar18 = SUB81(uVar62 >> 7,0);
                        *(uint *)(local_690.ray + 0x100) =
                             (uint)bVar64 * auVar93._0_4_ |
                             (uint)!bVar64 * *(int *)(local_690.ray + 0x100);
                        *(uint *)(local_690.ray + 0x104) =
                             (uint)bVar12 * auVar93._4_4_ |
                             (uint)!bVar12 * *(int *)(local_690.ray + 0x104);
                        *(uint *)(local_690.ray + 0x108) =
                             (uint)bVar13 * auVar93._8_4_ |
                             (uint)!bVar13 * *(int *)(local_690.ray + 0x108);
                        *(uint *)(local_690.ray + 0x10c) =
                             (uint)bVar14 * auVar93._12_4_ |
                             (uint)!bVar14 * *(int *)(local_690.ray + 0x10c);
                        *(uint *)(local_690.ray + 0x110) =
                             (uint)bVar15 * auVar93._16_4_ |
                             (uint)!bVar15 * *(int *)(local_690.ray + 0x110);
                        *(uint *)(local_690.ray + 0x114) =
                             (uint)bVar16 * auVar93._20_4_ |
                             (uint)!bVar16 * *(int *)(local_690.ray + 0x114);
                        *(uint *)(local_690.ray + 0x118) =
                             (uint)bVar17 * auVar93._24_4_ |
                             (uint)!bVar17 * *(int *)(local_690.ray + 0x118);
                        *(uint *)(local_690.ray + 0x11c) =
                             (uint)bVar18 * auVar93._28_4_ |
                             (uint)!bVar18 * *(int *)(local_690.ray + 0x11c);
                        uVar63 = CONCAT44(uStack_45c,local_460);
                        if (local_580 != (undefined1  [32])0x0) {
                          bVar64 = true;
                          break;
                        }
                      }
                      auVar73 = auVar196._0_16_;
                      *(int *)(ray + k * 4 + 0x100) = auVar183._0_4_;
                      uVar62 = local_400 & 0x3f;
                      bVar64 = false;
                      local_400 = 0;
                      uVar63 = uVar63 ^ 1L << uVar62;
                      for (uVar62 = uVar63; (uVar62 & 1) == 0;
                          uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                        local_400 = local_400 + 1;
                      }
                    } while (uVar63 != 0);
                  }
                  goto LAB_01ad7866;
                }
              }
            }
          }
          bVar64 = false;
        }
      }
LAB_01ad7866:
      if (8 < iVar9) {
        local_480 = vpbroadcastd_avx512vl();
        local_520 = vbroadcastss_avx512vl(auVar73);
        fStack_3f8 = 1.0 / (float)local_440._0_4_;
        local_440 = vpbroadcastd_avx512vl();
        local_420 = vpbroadcastd_avx512vl();
        lVar65 = 8;
        local_460 = uVar176;
        uStack_45c = uVar176;
        uStack_458 = uVar176;
        uStack_454 = uVar176;
        uStack_450 = uVar176;
        uStack_44c = uVar176;
        uStack_448 = uVar176;
        uStack_444 = uVar176;
        fStack_3f4 = fStack_3f8;
        fStack_3f0 = fStack_3f8;
        fStack_3ec = fStack_3f8;
        fStack_3e8 = fStack_3f8;
        fStack_3e4 = fStack_3f8;
        local_400._0_4_ = fStack_3f8;
        local_400._4_4_ = fStack_3f8;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar96 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar26 = vpcmpd_avx512vl(auVar96,local_480,1);
          auVar93 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar65 * 4 + lVar27);
          auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21b37f0 + lVar65 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar27 + 0x21b3c74 + lVar65 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar27 + 0x21b40f8 + lVar65 * 4);
          local_600 = auVar195._0_32_;
          auVar80 = vmulps_avx512vl(local_600,auVar97);
          local_620 = auVar194._0_32_;
          auVar81 = vmulps_avx512vl(local_620,auVar97);
          auVar38._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
          auVar38._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
          auVar38._8_4_ = auVar97._8_4_ * fStack_d8;
          auVar38._12_4_ = auVar97._12_4_ * fStack_d4;
          auVar38._16_4_ = auVar97._16_4_ * fStack_d0;
          auVar38._20_4_ = auVar97._20_4_ * fStack_cc;
          auVar38._24_4_ = auVar97._24_4_ * fStack_c8;
          auVar38._28_4_ = auVar96._28_4_;
          local_5c0 = auVar197._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar80,auVar98,local_5c0);
          local_5e0 = auVar198._0_32_;
          auVar80 = vfmadd231ps_avx512vl(auVar81,auVar98,local_5e0);
          auVar81 = vfmadd231ps_avx512vl(auVar38,auVar98,local_c0);
          auVar92 = auVar188._0_32_;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar92);
          auVar91 = auVar187._0_32_;
          auVar80 = vfmadd231ps_avx512vl(auVar80,auVar95,auVar91);
          auVar73 = vfmadd231ps_fma(auVar81,auVar95,local_a0);
          auVar99 = auVar192._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar99);
          local_4e0 = auVar193._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar80,auVar93,local_4e0);
          auVar96 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar65 * 4 + lVar27);
          auVar80 = *(undefined1 (*) [32])(lVar27 + 0x21b5c10 + lVar65 * 4);
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar93,local_80);
          auVar81 = *(undefined1 (*) [32])(lVar27 + 0x21b6094 + lVar65 * 4);
          auVar82 = *(undefined1 (*) [32])(lVar27 + 0x21b6518 + lVar65 * 4);
          auVar94 = vmulps_avx512vl(local_600,auVar82);
          auVar83 = vmulps_avx512vl(local_620,auVar82);
          auVar39._4_4_ = auVar82._4_4_ * (float)local_e0._4_4_;
          auVar39._0_4_ = auVar82._0_4_ * (float)local_e0._0_4_;
          auVar39._8_4_ = auVar82._8_4_ * fStack_d8;
          auVar39._12_4_ = auVar82._12_4_ * fStack_d4;
          auVar39._16_4_ = auVar82._16_4_ * fStack_d0;
          auVar39._20_4_ = auVar82._20_4_ * fStack_cc;
          auVar39._24_4_ = auVar82._24_4_ * fStack_c8;
          auVar39._28_4_ = uStack_c4;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar81,local_5c0);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar81,local_5e0);
          auVar86 = vfmadd231ps_avx512vl(auVar39,auVar81,local_c0);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar80,auVar92);
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar80,auVar91);
          auVar77 = vfmadd231ps_fma(auVar86,auVar80,local_a0);
          auVar86 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar99);
          auVar87 = vfmadd231ps_avx512vl(auVar83,auVar96,local_4e0);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar96,local_80);
          auVar88 = vmaxps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar77));
          auVar94 = vsubps_avx(auVar86,auVar84);
          auVar83 = vsubps_avx(auVar87,auVar85);
          auVar89 = vmulps_avx512vl(auVar85,auVar94);
          auVar90 = vmulps_avx512vl(auVar84,auVar83);
          auVar89 = vsubps_avx512vl(auVar89,auVar90);
          auVar90 = vmulps_avx512vl(auVar83,auVar83);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,auVar94);
          auVar88 = vmulps_avx512vl(auVar88,auVar88);
          auVar88 = vmulps_avx512vl(auVar88,auVar90);
          auVar89 = vmulps_avx512vl(auVar89,auVar89);
          uVar133 = vcmpps_avx512vl(auVar89,auVar88,2);
          bVar68 = (byte)uVar26 & (byte)uVar133;
          if (bVar68 == 0) {
            auVar188 = ZEXT3264(auVar92);
            auVar187 = ZEXT3264(auVar91);
          }
          else {
            auVar82 = vmulps_avx512vl(local_5a0,auVar82);
            auVar81 = vfmadd213ps_avx512vl(auVar81,local_140,auVar82);
            auVar80 = vfmadd213ps_avx512vl(auVar80,local_120,auVar81);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_100,auVar80);
            auVar97 = vmulps_avx512vl(local_5a0,auVar97);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_120,auVar98);
            auVar80 = vfmadd213ps_avx512vl(auVar93,local_100,auVar95);
            auVar93 = *(undefined1 (*) [32])(lVar27 + 0x21b457c + lVar65 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21b4a00 + lVar65 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar27 + 0x21b4e84 + lVar65 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar27 + 0x21b5308 + lVar65 * 4);
            auVar81 = vmulps_avx512vl(local_600,auVar97);
            auVar82 = vmulps_avx512vl(local_620,auVar97);
            auVar97 = vmulps_avx512vl(local_5a0,auVar97);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar98,local_5c0);
            auVar82 = vfmadd231ps_avx512vl(auVar82,auVar98,local_5e0);
            auVar98 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
            auVar97 = vfmadd231ps_avx512vl(auVar81,auVar95,auVar92);
            auVar81 = vfmadd231ps_avx512vl(auVar82,auVar95,auVar91);
            auVar95 = vfmadd231ps_avx512vl(auVar98,local_120,auVar95);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar99);
            auVar81 = vfmadd231ps_avx512vl(auVar81,auVar93,local_4e0);
            auVar82 = vfmadd231ps_avx512vl(auVar95,local_100,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar27 + 0x21b699c + lVar65 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21b72a4 + lVar65 * 4);
            auVar98 = *(undefined1 (*) [32])(lVar27 + 0x21b7728 + lVar65 * 4);
            auVar88 = vmulps_avx512vl(local_600,auVar98);
            auVar89 = vmulps_avx512vl(local_620,auVar98);
            auVar98 = vmulps_avx512vl(local_5a0,auVar98);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,local_5c0);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,local_5e0);
            auVar98 = vfmadd231ps_avx512vl(auVar98,local_140,auVar95);
            auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21b6e20 + lVar65 * 4);
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar95,auVar92);
            auVar89 = vfmadd231ps_avx512vl(auVar89,auVar95,auVar91);
            auVar95 = vfmadd231ps_avx512vl(auVar98,local_120,auVar95);
            auVar98 = vfmadd231ps_avx512vl(auVar88,auVar93,auVar99);
            auVar88 = vfmadd231ps_avx512vl(auVar89,auVar93,local_4e0);
            auVar95 = vfmadd231ps_avx512vl(auVar95,local_100,auVar93);
            auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar97,auVar89);
            vandps_avx512vl(auVar81,auVar89);
            auVar93 = vmaxps_avx(auVar89,auVar89);
            vandps_avx512vl(auVar82,auVar89);
            auVar93 = vmaxps_avx(auVar93,auVar89);
            uVar62 = vcmpps_avx512vl(auVar93,local_520,1);
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar106._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar97._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar106._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar97._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar106._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar97._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar106._12_4_ =
                 (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar97._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar106._16_4_ =
                 (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar97._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar106._20_4_ =
                 (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar97._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar106._24_4_ =
                 (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar97._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar106._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar97._28_4_;
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar107._0_4_ = (float)((uint)bVar12 * auVar83._0_4_ | (uint)!bVar12 * auVar81._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar107._4_4_ = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar81._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar107._8_4_ = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar81._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar107._12_4_ =
                 (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar81._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar107._16_4_ =
                 (float)((uint)bVar12 * auVar83._16_4_ | (uint)!bVar12 * auVar81._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar107._20_4_ =
                 (float)((uint)bVar12 * auVar83._20_4_ | (uint)!bVar12 * auVar81._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar107._24_4_ =
                 (float)((uint)bVar12 * auVar83._24_4_ | (uint)!bVar12 * auVar81._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar107._28_4_ = (uint)bVar12 * auVar83._28_4_ | (uint)!bVar12 * auVar81._28_4_;
            vandps_avx512vl(auVar98,auVar89);
            vandps_avx512vl(auVar88,auVar89);
            auVar93 = vmaxps_avx(auVar107,auVar107);
            vandps_avx512vl(auVar95,auVar89);
            auVar93 = vmaxps_avx(auVar93,auVar107);
            uVar62 = vcmpps_avx512vl(auVar93,local_520,1);
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar108._0_4_ = (uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar98._0_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar108._4_4_ = (uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar98._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar108._8_4_ = (uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar98._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar108._12_4_ = (uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar98._12_4_;
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar108._16_4_ = (uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar98._16_4_;
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar108._20_4_ = (uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar98._20_4_;
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar108._24_4_ = (uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar98._24_4_;
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar108._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar98._28_4_;
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar109._0_4_ = (float)((uint)bVar12 * auVar83._0_4_ | (uint)!bVar12 * auVar88._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar109._4_4_ = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar88._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar109._8_4_ = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar88._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar109._12_4_ =
                 (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar88._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar109._16_4_ =
                 (float)((uint)bVar12 * auVar83._16_4_ | (uint)!bVar12 * auVar88._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar109._20_4_ =
                 (float)((uint)bVar12 * auVar83._20_4_ | (uint)!bVar12 * auVar88._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar109._24_4_ =
                 (float)((uint)bVar12 * auVar83._24_4_ | (uint)!bVar12 * auVar88._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar109._28_4_ = (uint)bVar12 * auVar83._28_4_ | (uint)!bVar12 * auVar88._28_4_;
            auVar175._8_4_ = 0x80000000;
            auVar175._0_8_ = 0x8000000080000000;
            auVar175._12_4_ = 0x80000000;
            auVar175._16_4_ = 0x80000000;
            auVar175._20_4_ = 0x80000000;
            auVar175._24_4_ = 0x80000000;
            auVar175._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar108,auVar175);
            auVar88 = auVar191._0_32_;
            auVar95 = vfmadd213ps_avx512vl(auVar106,auVar106,auVar88);
            auVar20 = vfmadd231ps_fma(auVar95,auVar107,auVar107);
            auVar95 = vrsqrt14ps_avx512vl(ZEXT1632(auVar20));
            auVar186._8_4_ = 0xbf000000;
            auVar186._0_8_ = 0xbf000000bf000000;
            auVar186._12_4_ = 0xbf000000;
            auVar186._16_4_ = 0xbf000000;
            auVar186._20_4_ = 0xbf000000;
            auVar186._24_4_ = 0xbf000000;
            auVar186._28_4_ = 0xbf000000;
            fVar142 = auVar95._0_4_;
            fVar130 = auVar95._4_4_;
            fVar131 = auVar95._8_4_;
            fVar132 = auVar95._12_4_;
            fVar165 = auVar95._16_4_;
            fVar169 = auVar95._20_4_;
            fVar69 = auVar95._24_4_;
            auVar40._4_4_ = fVar130 * fVar130 * fVar130 * auVar20._4_4_ * -0.5;
            auVar40._0_4_ = fVar142 * fVar142 * fVar142 * auVar20._0_4_ * -0.5;
            auVar40._8_4_ = fVar131 * fVar131 * fVar131 * auVar20._8_4_ * -0.5;
            auVar40._12_4_ = fVar132 * fVar132 * fVar132 * auVar20._12_4_ * -0.5;
            auVar40._16_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar40._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
            auVar40._24_4_ = fVar69 * fVar69 * fVar69 * -0.0;
            auVar40._28_4_ = auVar107._28_4_;
            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar95 = vfmadd231ps_avx512vl(auVar40,auVar98,auVar95);
            auVar41._4_4_ = auVar107._4_4_ * auVar95._4_4_;
            auVar41._0_4_ = auVar107._0_4_ * auVar95._0_4_;
            auVar41._8_4_ = auVar107._8_4_ * auVar95._8_4_;
            auVar41._12_4_ = auVar107._12_4_ * auVar95._12_4_;
            auVar41._16_4_ = auVar107._16_4_ * auVar95._16_4_;
            auVar41._20_4_ = auVar107._20_4_ * auVar95._20_4_;
            auVar41._24_4_ = auVar107._24_4_ * auVar95._24_4_;
            auVar41._28_4_ = 0;
            auVar42._4_4_ = auVar95._4_4_ * -auVar106._4_4_;
            auVar42._0_4_ = auVar95._0_4_ * -auVar106._0_4_;
            auVar42._8_4_ = auVar95._8_4_ * -auVar106._8_4_;
            auVar42._12_4_ = auVar95._12_4_ * -auVar106._12_4_;
            auVar42._16_4_ = auVar95._16_4_ * -auVar106._16_4_;
            auVar42._20_4_ = auVar95._20_4_ * -auVar106._20_4_;
            auVar42._24_4_ = auVar95._24_4_ * -auVar106._24_4_;
            auVar42._28_4_ = auVar107._28_4_;
            auVar97 = vmulps_avx512vl(auVar95,auVar88);
            auVar95 = vfmadd213ps_avx512vl(auVar108,auVar108,auVar88);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar109,auVar109);
            auVar81 = vrsqrt14ps_avx512vl(auVar95);
            auVar95 = vmulps_avx512vl(auVar95,auVar186);
            fVar142 = auVar81._0_4_;
            fVar130 = auVar81._4_4_;
            fVar131 = auVar81._8_4_;
            fVar132 = auVar81._12_4_;
            fVar165 = auVar81._16_4_;
            fVar169 = auVar81._20_4_;
            fVar69 = auVar81._24_4_;
            auVar43._4_4_ = fVar130 * fVar130 * fVar130 * auVar95._4_4_;
            auVar43._0_4_ = fVar142 * fVar142 * fVar142 * auVar95._0_4_;
            auVar43._8_4_ = fVar131 * fVar131 * fVar131 * auVar95._8_4_;
            auVar43._12_4_ = fVar132 * fVar132 * fVar132 * auVar95._12_4_;
            auVar43._16_4_ = fVar165 * fVar165 * fVar165 * auVar95._16_4_;
            auVar43._20_4_ = fVar169 * fVar169 * fVar169 * auVar95._20_4_;
            auVar43._24_4_ = fVar69 * fVar69 * fVar69 * auVar95._24_4_;
            auVar43._28_4_ = auVar95._28_4_;
            auVar95 = vfmadd231ps_avx512vl(auVar43,auVar98,auVar81);
            auVar44._4_4_ = auVar109._4_4_ * auVar95._4_4_;
            auVar44._0_4_ = auVar109._0_4_ * auVar95._0_4_;
            auVar44._8_4_ = auVar109._8_4_ * auVar95._8_4_;
            auVar44._12_4_ = auVar109._12_4_ * auVar95._12_4_;
            auVar44._16_4_ = auVar109._16_4_ * auVar95._16_4_;
            auVar44._20_4_ = auVar109._20_4_ * auVar95._20_4_;
            auVar44._24_4_ = auVar109._24_4_ * auVar95._24_4_;
            auVar44._28_4_ = auVar81._28_4_;
            auVar45._4_4_ = auVar95._4_4_ * auVar93._4_4_;
            auVar45._0_4_ = auVar95._0_4_ * auVar93._0_4_;
            auVar45._8_4_ = auVar95._8_4_ * auVar93._8_4_;
            auVar45._12_4_ = auVar95._12_4_ * auVar93._12_4_;
            auVar45._16_4_ = auVar95._16_4_ * auVar93._16_4_;
            auVar45._20_4_ = auVar95._20_4_ * auVar93._20_4_;
            auVar45._24_4_ = auVar95._24_4_ * auVar93._24_4_;
            auVar45._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar95,auVar88);
            auVar20 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar73),auVar84);
            auVar95 = ZEXT1632(auVar73);
            auVar21 = vfmadd213ps_fma(auVar42,auVar95,auVar85);
            auVar98 = vfmadd213ps_avx512vl(auVar97,auVar95,auVar80);
            auVar81 = vfmadd213ps_avx512vl(auVar44,ZEXT1632(auVar77),auVar86);
            auVar72 = vfnmadd213ps_fma(auVar41,auVar95,auVar84);
            auVar82 = ZEXT1632(auVar77);
            auVar190 = vfmadd213ps_fma(auVar45,auVar82,auVar87);
            auVar71 = vfnmadd213ps_fma(auVar42,auVar95,auVar85);
            auVar24 = vfmadd213ps_fma(auVar93,auVar82,auVar96);
            auVar85 = ZEXT1632(auVar73);
            auVar127 = vfnmadd231ps_fma(auVar80,auVar85,auVar97);
            auVar78 = vfnmadd213ps_fma(auVar44,auVar82,auVar86);
            auVar126 = vfnmadd213ps_fma(auVar45,auVar82,auVar87);
            auVar134 = vfnmadd231ps_fma(auVar96,ZEXT1632(auVar77),auVar93);
            auVar96 = vsubps_avx512vl(auVar81,ZEXT1632(auVar72));
            auVar93 = vsubps_avx(ZEXT1632(auVar190),ZEXT1632(auVar71));
            auVar95 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar127));
            auVar46._4_4_ = auVar93._4_4_ * auVar127._4_4_;
            auVar46._0_4_ = auVar93._0_4_ * auVar127._0_4_;
            auVar46._8_4_ = auVar93._8_4_ * auVar127._8_4_;
            auVar46._12_4_ = auVar93._12_4_ * auVar127._12_4_;
            auVar46._16_4_ = auVar93._16_4_ * 0.0;
            auVar46._20_4_ = auVar93._20_4_ * 0.0;
            auVar46._24_4_ = auVar93._24_4_ * 0.0;
            auVar46._28_4_ = auVar97._28_4_;
            auVar73 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar71),auVar95);
            auVar47._4_4_ = auVar95._4_4_ * auVar72._4_4_;
            auVar47._0_4_ = auVar95._0_4_ * auVar72._0_4_;
            auVar47._8_4_ = auVar95._8_4_ * auVar72._8_4_;
            auVar47._12_4_ = auVar95._12_4_ * auVar72._12_4_;
            auVar47._16_4_ = auVar95._16_4_ * 0.0;
            auVar47._20_4_ = auVar95._20_4_ * 0.0;
            auVar47._24_4_ = auVar95._24_4_ * 0.0;
            auVar47._28_4_ = auVar95._28_4_;
            auVar76 = vfmsub231ps_fma(auVar47,ZEXT1632(auVar127),auVar96);
            auVar48._4_4_ = auVar71._4_4_ * auVar96._4_4_;
            auVar48._0_4_ = auVar71._0_4_ * auVar96._0_4_;
            auVar48._8_4_ = auVar71._8_4_ * auVar96._8_4_;
            auVar48._12_4_ = auVar71._12_4_ * auVar96._12_4_;
            auVar48._16_4_ = auVar96._16_4_ * 0.0;
            auVar48._20_4_ = auVar96._20_4_ * 0.0;
            auVar48._24_4_ = auVar96._24_4_ * 0.0;
            auVar48._28_4_ = auVar96._28_4_;
            auVar74 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar72),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar88,ZEXT1632(auVar76));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar73));
            uVar62 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar61 = (byte)uVar62;
            fVar117 = (float)((uint)(bVar61 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar78._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar119 = (float)((uint)bVar12 * auVar20._4_4_ | (uint)!bVar12 * auVar78._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar122 = (float)((uint)bVar12 * auVar20._8_4_ | (uint)!bVar12 * auVar78._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar123 = (float)((uint)bVar12 * auVar20._12_4_ | (uint)!bVar12 * auVar78._12_4_);
            auVar82 = ZEXT1632(CONCAT412(fVar123,CONCAT48(fVar122,CONCAT44(fVar119,fVar117))));
            fVar118 = (float)((uint)(bVar61 & 1) * auVar21._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar126._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar121 = (float)((uint)bVar12 * auVar21._4_4_ | (uint)!bVar12 * auVar126._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar120 = (float)((uint)bVar12 * auVar21._8_4_ | (uint)!bVar12 * auVar126._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar124 = (float)((uint)bVar12 * auVar21._12_4_ | (uint)!bVar12 * auVar126._12_4_);
            auVar94 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar120,CONCAT44(fVar121,fVar118))));
            auVar110._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar134._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar134._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar134._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar134._12_4_);
            fVar142 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_);
            auVar110._16_4_ = fVar142;
            fVar130 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_);
            auVar110._20_4_ = fVar130;
            fVar131 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_);
            auVar110._24_4_ = fVar131;
            iVar1 = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
            auVar110._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar72),auVar81);
            auVar111._0_4_ =
                 (uint)(bVar61 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar73._0_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar111._4_4_ = (uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar73._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar111._8_4_ = (uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar73._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar111._12_4_ = (uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar73._12_4_;
            auVar111._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar93._16_4_;
            auVar111._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar93._20_4_;
            auVar111._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar93._24_4_;
            auVar111._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar71),ZEXT1632(auVar190));
            auVar112._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar20._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar20._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar20._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar20._12_4_);
            fVar165 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar93._16_4_);
            auVar112._16_4_ = fVar165;
            fVar132 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar93._20_4_);
            auVar112._20_4_ = fVar132;
            fVar169 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar93._24_4_);
            auVar112._24_4_ = fVar169;
            auVar112._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar127),ZEXT1632(auVar24));
            auVar113._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar21._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar21._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar21._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar21._12_4_);
            fVar116 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar93._16_4_);
            auVar113._16_4_ = fVar116;
            fVar70 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar93._20_4_);
            auVar113._20_4_ = fVar70;
            fVar69 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar93._24_4_);
            auVar113._24_4_ = fVar69;
            iVar2 = (uint)(byte)(uVar62 >> 7) * auVar93._28_4_;
            auVar113._28_4_ = iVar2;
            auVar114._0_4_ =
                 (uint)(bVar61 & 1) * (int)auVar72._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar81._0_4_
            ;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar114._4_4_ = (uint)bVar12 * (int)auVar72._4_4_ | (uint)!bVar12 * auVar81._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar114._8_4_ = (uint)bVar12 * (int)auVar72._8_4_ | (uint)!bVar12 * auVar81._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar114._12_4_ = (uint)bVar12 * (int)auVar72._12_4_ | (uint)!bVar12 * auVar81._12_4_;
            auVar114._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar81._16_4_;
            auVar114._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar81._20_4_;
            auVar114._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar81._24_4_;
            auVar114._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar81._28_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar81 = vsubps_avx512vl(auVar114,auVar82);
            auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar71._12_4_ |
                                                    (uint)!bVar16 * auVar190._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar71._8_4_ |
                                                             (uint)!bVar14 * auVar190._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar71._4_4_ |
                                                                      (uint)!bVar12 * auVar190._4_4_
                                                                      ,(uint)(bVar61 & 1) *
                                                                       (int)auVar71._0_4_ |
                                                                       (uint)!(bool)(bVar61 & 1) *
                                                                       auVar190._0_4_)))),auVar94);
            auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar127._12_4_ |
                                                    (uint)!bVar17 * auVar24._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar127._8_4_ |
                                                             (uint)!bVar15 * auVar24._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar127._4_4_ |
                                                                      (uint)!bVar13 * auVar24._4_4_,
                                                                      (uint)(bVar61 & 1) *
                                                                      (int)auVar127._0_4_ |
                                                                      (uint)!(bool)(bVar61 & 1) *
                                                                      auVar24._0_4_)))),auVar110);
            auVar97 = vsubps_avx(auVar82,auVar111);
            auVar96 = vsubps_avx(auVar94,auVar112);
            auVar80 = vsubps_avx(auVar110,auVar113);
            auVar49._4_4_ = auVar98._4_4_ * fVar119;
            auVar49._0_4_ = auVar98._0_4_ * fVar117;
            auVar49._8_4_ = auVar98._8_4_ * fVar122;
            auVar49._12_4_ = auVar98._12_4_ * fVar123;
            auVar49._16_4_ = auVar98._16_4_ * 0.0;
            auVar49._20_4_ = auVar98._20_4_ * 0.0;
            auVar49._24_4_ = auVar98._24_4_ * 0.0;
            auVar49._28_4_ = 0;
            auVar73 = vfmsub231ps_fma(auVar49,auVar110,auVar81);
            auVar151._0_4_ = fVar118 * auVar81._0_4_;
            auVar151._4_4_ = fVar121 * auVar81._4_4_;
            auVar151._8_4_ = fVar120 * auVar81._8_4_;
            auVar151._12_4_ = fVar124 * auVar81._12_4_;
            auVar151._16_4_ = auVar81._16_4_ * 0.0;
            auVar151._20_4_ = auVar81._20_4_ * 0.0;
            auVar151._24_4_ = auVar81._24_4_ * 0.0;
            auVar151._28_4_ = 0;
            auVar20 = vfmsub231ps_fma(auVar151,auVar82,auVar95);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar88,ZEXT1632(auVar73));
            auVar157._0_4_ = auVar95._0_4_ * auVar110._0_4_;
            auVar157._4_4_ = auVar95._4_4_ * auVar110._4_4_;
            auVar157._8_4_ = auVar95._8_4_ * auVar110._8_4_;
            auVar157._12_4_ = auVar95._12_4_ * auVar110._12_4_;
            auVar157._16_4_ = auVar95._16_4_ * fVar142;
            auVar157._20_4_ = auVar95._20_4_ * fVar130;
            auVar157._24_4_ = auVar95._24_4_ * fVar131;
            auVar157._28_4_ = 0;
            auVar73 = vfmsub231ps_fma(auVar157,auVar94,auVar98);
            auVar83 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar73));
            auVar93 = vmulps_avx512vl(auVar80,auVar111);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar97,auVar113);
            auVar50._4_4_ = auVar96._4_4_ * auVar113._4_4_;
            auVar50._0_4_ = auVar96._0_4_ * auVar113._0_4_;
            auVar50._8_4_ = auVar96._8_4_ * auVar113._8_4_;
            auVar50._12_4_ = auVar96._12_4_ * auVar113._12_4_;
            auVar50._16_4_ = auVar96._16_4_ * fVar116;
            auVar50._20_4_ = auVar96._20_4_ * fVar70;
            auVar50._24_4_ = auVar96._24_4_ * fVar69;
            auVar50._28_4_ = iVar2;
            auVar73 = vfmsub231ps_fma(auVar50,auVar112,auVar80);
            auVar158._0_4_ = auVar112._0_4_ * auVar97._0_4_;
            auVar158._4_4_ = auVar112._4_4_ * auVar97._4_4_;
            auVar158._8_4_ = auVar112._8_4_ * auVar97._8_4_;
            auVar158._12_4_ = auVar112._12_4_ * auVar97._12_4_;
            auVar158._16_4_ = fVar165 * auVar97._16_4_;
            auVar158._20_4_ = fVar132 * auVar97._20_4_;
            auVar158._24_4_ = fVar169 * auVar97._24_4_;
            auVar158._28_4_ = 0;
            auVar20 = vfmsub231ps_fma(auVar158,auVar96,auVar111);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar88,auVar93);
            auVar84 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar73));
            auVar93 = vmaxps_avx(auVar83,auVar84);
            uVar133 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar68 = bVar68 & (byte)uVar133;
            if (bVar68 != 0) {
              uVar125 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar182._4_4_ = uVar125;
              auVar182._0_4_ = uVar125;
              auVar182._8_4_ = uVar125;
              auVar182._12_4_ = uVar125;
              auVar182._16_4_ = uVar125;
              auVar182._20_4_ = uVar125;
              auVar182._24_4_ = uVar125;
              auVar182._28_4_ = uVar125;
              auVar196 = ZEXT3264(auVar182);
              auVar51._4_4_ = auVar80._4_4_ * auVar95._4_4_;
              auVar51._0_4_ = auVar80._0_4_ * auVar95._0_4_;
              auVar51._8_4_ = auVar80._8_4_ * auVar95._8_4_;
              auVar51._12_4_ = auVar80._12_4_ * auVar95._12_4_;
              auVar51._16_4_ = auVar80._16_4_ * auVar95._16_4_;
              auVar51._20_4_ = auVar80._20_4_ * auVar95._20_4_;
              auVar51._24_4_ = auVar80._24_4_ * auVar95._24_4_;
              auVar51._28_4_ = auVar93._28_4_;
              auVar21 = vfmsub231ps_fma(auVar51,auVar96,auVar98);
              auVar52._4_4_ = auVar98._4_4_ * auVar97._4_4_;
              auVar52._0_4_ = auVar98._0_4_ * auVar97._0_4_;
              auVar52._8_4_ = auVar98._8_4_ * auVar97._8_4_;
              auVar52._12_4_ = auVar98._12_4_ * auVar97._12_4_;
              auVar52._16_4_ = auVar98._16_4_ * auVar97._16_4_;
              auVar52._20_4_ = auVar98._20_4_ * auVar97._20_4_;
              auVar52._24_4_ = auVar98._24_4_ * auVar97._24_4_;
              auVar52._28_4_ = auVar98._28_4_;
              auVar20 = vfmsub231ps_fma(auVar52,auVar81,auVar80);
              auVar53._4_4_ = auVar96._4_4_ * auVar81._4_4_;
              auVar53._0_4_ = auVar96._0_4_ * auVar81._0_4_;
              auVar53._8_4_ = auVar96._8_4_ * auVar81._8_4_;
              auVar53._12_4_ = auVar96._12_4_ * auVar81._12_4_;
              auVar53._16_4_ = auVar96._16_4_ * auVar81._16_4_;
              auVar53._20_4_ = auVar96._20_4_ * auVar81._20_4_;
              auVar53._24_4_ = auVar96._24_4_ * auVar81._24_4_;
              auVar53._28_4_ = auVar96._28_4_;
              auVar190 = vfmsub231ps_fma(auVar53,auVar97,auVar95);
              auVar73 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar190));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar21),auVar88);
              auVar95 = vrcp14ps_avx512vl(auVar93);
              auVar97 = auVar189._0_32_;
              auVar98 = vfnmadd213ps_avx512vl(auVar95,auVar93,auVar97);
              auVar73 = vfmadd132ps_fma(auVar98,auVar95,auVar95);
              auVar54._4_4_ = auVar190._4_4_ * auVar110._4_4_;
              auVar54._0_4_ = auVar190._0_4_ * auVar110._0_4_;
              auVar54._8_4_ = auVar190._8_4_ * auVar110._8_4_;
              auVar54._12_4_ = auVar190._12_4_ * auVar110._12_4_;
              auVar54._16_4_ = fVar142 * 0.0;
              auVar54._20_4_ = fVar130 * 0.0;
              auVar54._24_4_ = fVar131 * 0.0;
              auVar54._28_4_ = iVar1;
              auVar20 = vfmadd231ps_fma(auVar54,auVar94,ZEXT1632(auVar20));
              auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar82,ZEXT1632(auVar21));
              fVar142 = auVar73._0_4_;
              fVar130 = auVar73._4_4_;
              fVar131 = auVar73._8_4_;
              fVar132 = auVar73._12_4_;
              local_380 = ZEXT1632(CONCAT412(auVar20._12_4_ * fVar132,
                                             CONCAT48(auVar20._8_4_ * fVar131,
                                                      CONCAT44(auVar20._4_4_ * fVar130,
                                                               auVar20._0_4_ * fVar142))));
              uVar133 = vcmpps_avx512vl(local_380,auVar182,2);
              auVar60._4_4_ = uStack_45c;
              auVar60._0_4_ = local_460;
              auVar60._8_4_ = uStack_458;
              auVar60._12_4_ = uStack_454;
              auVar60._16_4_ = uStack_450;
              auVar60._20_4_ = uStack_44c;
              auVar60._24_4_ = uStack_448;
              auVar60._28_4_ = uStack_444;
              uVar26 = vcmpps_avx512vl(local_380,auVar60,0xd);
              bVar68 = (byte)uVar133 & (byte)uVar26 & bVar68;
              if (bVar68 != 0) {
                uVar133 = vcmpps_avx512vl(auVar93,auVar88,4);
                bVar68 = bVar68 & (byte)uVar133;
                auVar188 = ZEXT3264(local_640);
                auVar187 = ZEXT3264(local_660);
                if (bVar68 != 0) {
                  fVar165 = auVar83._0_4_ * fVar142;
                  fVar169 = auVar83._4_4_ * fVar130;
                  auVar55._4_4_ = fVar169;
                  auVar55._0_4_ = fVar165;
                  fVar69 = auVar83._8_4_ * fVar131;
                  auVar55._8_4_ = fVar69;
                  fVar70 = auVar83._12_4_ * fVar132;
                  auVar55._12_4_ = fVar70;
                  fVar116 = auVar83._16_4_ * 0.0;
                  auVar55._16_4_ = fVar116;
                  fVar117 = auVar83._20_4_ * 0.0;
                  auVar55._20_4_ = fVar117;
                  fVar118 = auVar83._24_4_ * 0.0;
                  auVar55._24_4_ = fVar118;
                  auVar55._28_4_ = auVar93._28_4_;
                  auVar95 = vsubps_avx512vl(auVar97,auVar55);
                  local_3c0._0_4_ =
                       (float)((uint)(bVar61 & 1) * (int)fVar165 |
                              (uint)!(bool)(bVar61 & 1) * auVar95._0_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                  local_3c0._4_4_ =
                       (float)((uint)bVar12 * (int)fVar169 | (uint)!bVar12 * auVar95._4_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                  local_3c0._8_4_ =
                       (float)((uint)bVar12 * (int)fVar69 | (uint)!bVar12 * auVar95._8_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                  local_3c0._12_4_ =
                       (float)((uint)bVar12 * (int)fVar70 | (uint)!bVar12 * auVar95._12_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                  local_3c0._16_4_ =
                       (float)((uint)bVar12 * (int)fVar116 | (uint)!bVar12 * auVar95._16_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                  local_3c0._20_4_ =
                       (float)((uint)bVar12 * (int)fVar117 | (uint)!bVar12 * auVar95._20_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                  local_3c0._24_4_ =
                       (float)((uint)bVar12 * (int)fVar118 | (uint)!bVar12 * auVar95._24_4_);
                  bVar12 = SUB81(uVar62 >> 7,0);
                  local_3c0._28_4_ =
                       (float)((uint)bVar12 * auVar93._28_4_ | (uint)!bVar12 * auVar95._28_4_);
                  auVar93 = vsubps_avx(ZEXT1632(auVar77),auVar85);
                  auVar73 = vfmadd213ps_fma(auVar93,local_3c0,auVar85);
                  uVar125 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar31._4_4_ = uVar125;
                  auVar31._0_4_ = uVar125;
                  auVar31._8_4_ = uVar125;
                  auVar31._12_4_ = uVar125;
                  auVar31._16_4_ = uVar125;
                  auVar31._20_4_ = uVar125;
                  auVar31._24_4_ = uVar125;
                  auVar31._28_4_ = uVar125;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar73._12_4_ + auVar73._12_4_,
                                                               CONCAT48(auVar73._8_4_ +
                                                                        auVar73._8_4_,
                                                                        CONCAT44(auVar73._4_4_ +
                                                                                 auVar73._4_4_,
                                                                                 auVar73._0_4_ +
                                                                                 auVar73._0_4_)))),
                                            auVar31);
                  uVar133 = vcmpps_avx512vl(local_380,auVar93,6);
                  if (((byte)uVar133 & bVar68) != 0) {
                    auVar138._0_4_ = auVar84._0_4_ * fVar142;
                    auVar138._4_4_ = auVar84._4_4_ * fVar130;
                    auVar138._8_4_ = auVar84._8_4_ * fVar131;
                    auVar138._12_4_ = auVar84._12_4_ * fVar132;
                    auVar138._16_4_ = auVar84._16_4_ * 0.0;
                    auVar138._20_4_ = auVar84._20_4_ * 0.0;
                    auVar138._24_4_ = auVar84._24_4_ * 0.0;
                    auVar138._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar97,auVar138);
                    auVar115._0_4_ =
                         (uint)(bVar61 & 1) * (int)auVar138._0_4_ |
                         (uint)!(bool)(bVar61 & 1) * auVar93._0_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                    auVar115._4_4_ =
                         (uint)bVar12 * (int)auVar138._4_4_ | (uint)!bVar12 * auVar93._4_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                    auVar115._8_4_ =
                         (uint)bVar12 * (int)auVar138._8_4_ | (uint)!bVar12 * auVar93._8_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                    auVar115._12_4_ =
                         (uint)bVar12 * (int)auVar138._12_4_ | (uint)!bVar12 * auVar93._12_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                    auVar115._16_4_ =
                         (uint)bVar12 * (int)auVar138._16_4_ | (uint)!bVar12 * auVar93._16_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                    auVar115._20_4_ =
                         (uint)bVar12 * (int)auVar138._20_4_ | (uint)!bVar12 * auVar93._20_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                    auVar115._24_4_ =
                         (uint)bVar12 * (int)auVar138._24_4_ | (uint)!bVar12 * auVar93._24_4_;
                    auVar115._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar93._28_4_;
                    auVar32._8_4_ = 0x40000000;
                    auVar32._0_8_ = 0x4000000040000000;
                    auVar32._12_4_ = 0x40000000;
                    auVar32._16_4_ = 0x40000000;
                    auVar32._20_4_ = 0x40000000;
                    auVar32._24_4_ = 0x40000000;
                    auVar32._28_4_ = 0x40000000;
                    local_3a0 = vfmsub132ps_avx512vl(auVar115,auVar97,auVar32);
                    local_360 = (undefined4)lVar65;
                    pGVar10 = (context->scene->geometries).items[uVar66].ptr;
                    if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar61 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar61 = 1, pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar73 = vcvtsi2ss_avx512f(auVar189._0_16_,local_360);
                      fVar142 = auVar73._0_4_;
                      local_300[0] = (fVar142 + local_3c0._0_4_ + 0.0) * (float)local_400;
                      local_300[1] = (fVar142 + local_3c0._4_4_ + 1.0) * local_400._4_4_;
                      local_300[2] = (fVar142 + local_3c0._8_4_ + 2.0) * fStack_3f8;
                      local_300[3] = (fVar142 + local_3c0._12_4_ + 3.0) * fStack_3f4;
                      fStack_2f0 = (fVar142 + local_3c0._16_4_ + 4.0) * fStack_3f0;
                      fStack_2ec = (fVar142 + local_3c0._20_4_ + 5.0) * fStack_3ec;
                      fStack_2e8 = (fVar142 + local_3c0._24_4_ + 6.0) * fStack_3e8;
                      fStack_2e4 = fVar142 + local_3c0._28_4_ + 7.0;
                      local_2e0 = local_3a0;
                      local_2c0 = local_380;
                      uVar62 = CONCAT71(0,(byte)uVar133 & bVar68);
                      local_540._0_8_ = uVar62;
                      lVar28 = 0;
                      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                        lVar28 = lVar28 + 1;
                      }
                      local_4a0._0_8_ = lVar28;
                      local_2a0 = auVar182;
                      local_4c0._0_8_ = pGVar10;
                      local_35c = iVar9;
                      local_350 = auVar75;
                      local_340 = uVar25;
                      uStack_338 = uVar56;
                      local_330 = uVar57;
                      uStack_328 = uVar58;
                      do {
                        auVar190 = auVar191._0_16_;
                        fVar142 = local_300[local_4a0._0_8_];
                        auVar137._4_4_ = fVar142;
                        auVar137._0_4_ = fVar142;
                        auVar137._8_4_ = fVar142;
                        auVar137._12_4_ = fVar142;
                        local_200._16_4_ = fVar142;
                        local_200._0_16_ = auVar137;
                        local_200._20_4_ = fVar142;
                        local_200._24_4_ = fVar142;
                        local_200._28_4_ = fVar142;
                        local_1e0 = *(undefined4 *)(local_2e0 + local_4a0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2c0 + local_4a0._0_8_ * 4);
                        local_690.context = context->user;
                        fVar130 = 1.0 - fVar142;
                        auVar21 = vfnmadd231ss_fma(ZEXT416((uint)(fVar142 * (fVar130 + fVar130))),
                                                   ZEXT416((uint)fVar130),ZEXT416((uint)fVar130));
                        auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar137,
                                                  ZEXT416(0xc0a00000));
                        auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142 * 3.0)),
                                                  ZEXT416((uint)(fVar142 + fVar142)),auVar73);
                        auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar137,
                                                  ZEXT416(0x40000000));
                        auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar130 * fVar130 * -3.0)),
                                                  ZEXT416((uint)(fVar130 + fVar130)),auVar73);
                        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar142 * fVar142)),auVar137,
                                                  ZEXT416((uint)(fVar130 * -2.0)));
                        fVar142 = auVar21._0_4_ * 0.5;
                        fVar130 = auVar77._0_4_ * 0.5;
                        fVar131 = auVar73._0_4_ * 0.5;
                        fVar132 = auVar20._0_4_ * 0.5;
                        auVar149._0_4_ = fVar132 * local_560;
                        auVar149._4_4_ = fVar132 * fStack_55c;
                        auVar149._8_4_ = fVar132 * fStack_558;
                        auVar149._12_4_ = fVar132 * fStack_554;
                        auVar162._4_4_ = fVar131;
                        auVar162._0_4_ = fVar131;
                        auVar162._8_4_ = fVar131;
                        auVar162._12_4_ = fVar131;
                        auVar73 = vfmadd132ps_fma(auVar162,auVar149,auVar22);
                        auVar150._4_4_ = fVar130;
                        auVar150._0_4_ = fVar130;
                        auVar150._8_4_ = fVar130;
                        auVar150._12_4_ = fVar130;
                        auVar73 = vfmadd132ps_fma(auVar150,auVar73,auVar23);
                        auVar129._4_4_ = fVar142;
                        auVar129._0_4_ = fVar142;
                        auVar129._8_4_ = fVar142;
                        auVar129._12_4_ = fVar142;
                        auVar73 = vfmadd213ps_fma(auVar129,auVar75,auVar73);
                        local_260 = auVar73._0_4_;
                        auVar159._8_4_ = 1;
                        auVar159._0_8_ = 0x100000001;
                        auVar159._12_4_ = 1;
                        auVar159._16_4_ = 1;
                        auVar159._20_4_ = 1;
                        auVar159._24_4_ = 1;
                        auVar159._28_4_ = 1;
                        local_240 = vpermps_avx2(auVar159,ZEXT1632(auVar73));
                        auVar164._8_4_ = 2;
                        auVar164._0_8_ = 0x200000002;
                        auVar164._12_4_ = 2;
                        auVar164._16_4_ = 2;
                        auVar164._20_4_ = 2;
                        auVar164._24_4_ = 2;
                        auVar164._28_4_ = 2;
                        local_220 = vpermps_avx2(auVar164,ZEXT1632(auVar73));
                        uStack_25c = local_260;
                        uStack_258 = local_260;
                        uStack_254 = local_260;
                        uStack_250 = local_260;
                        uStack_24c = local_260;
                        uStack_248 = local_260;
                        uStack_244 = local_260;
                        uStack_1dc = local_1e0;
                        uStack_1d8 = local_1e0;
                        uStack_1d4 = local_1e0;
                        uStack_1d0 = local_1e0;
                        uStack_1cc = local_1e0;
                        uStack_1c8 = local_1e0;
                        uStack_1c4 = local_1e0;
                        local_1c0 = local_420._0_8_;
                        uStack_1b8 = local_420._8_8_;
                        uStack_1b0 = local_420._16_8_;
                        uStack_1a8 = local_420._24_8_;
                        local_1a0 = local_440;
                        vpcmpeqd_avx2(local_440,local_440);
                        local_180 = (local_690.context)->instID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = (local_690.context)->instPrimID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_580 = local_280;
                        local_690.valid = (int *)local_580;
                        local_690.geometryUserPtr = *(void **)(local_4c0._0_8_ + 0x18);
                        local_690.hit = (RTCHitN *)&local_260;
                        local_690.N = 8;
                        local_690.ray = (RTCRayN *)ray;
                        if (*(code **)(local_4c0._0_8_ + 0x48) != (code *)0x0) {
                          (**(code **)(local_4c0._0_8_ + 0x48))(&local_690);
                          auVar196 = ZEXT3264(local_2a0);
                          auVar187 = ZEXT3264(local_660);
                          auVar188 = ZEXT3264(local_640);
                          auVar193 = ZEXT3264(local_4e0);
                          auVar192 = ZEXT3264(local_500);
                          auVar73 = vxorps_avx512vl(auVar190,auVar190);
                          auVar191 = ZEXT1664(auVar73);
                        }
                        auVar73 = auVar191._0_16_;
                        if (local_580 == (undefined1  [32])0x0) {
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar189 = ZEXT3264(auVar93);
                          auVar197 = ZEXT3264(local_5c0);
                          auVar198 = ZEXT3264(local_5e0);
                          auVar195 = ZEXT3264(local_600);
                          auVar194 = ZEXT3264(local_620);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_4c0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            (*p_Var11)(&local_690);
                            auVar196 = ZEXT3264(local_2a0);
                            auVar187 = ZEXT3264(local_660);
                            auVar188 = ZEXT3264(local_640);
                            auVar193 = ZEXT3264(local_4e0);
                            auVar192 = ZEXT3264(local_500);
                            auVar73 = vxorps_avx512vl(auVar73,auVar73);
                            auVar191 = ZEXT1664(auVar73);
                          }
                          uVar62 = vptestmd_avx512vl(local_580,local_580);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar62 & 1);
                          bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar19 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_690.ray + 0x100) =
                               (uint)bVar12 * auVar93._0_4_ |
                               (uint)!bVar12 * *(int *)(local_690.ray + 0x100);
                          *(uint *)(local_690.ray + 0x104) =
                               (uint)bVar13 * auVar93._4_4_ |
                               (uint)!bVar13 * *(int *)(local_690.ray + 0x104);
                          *(uint *)(local_690.ray + 0x108) =
                               (uint)bVar14 * auVar93._8_4_ |
                               (uint)!bVar14 * *(int *)(local_690.ray + 0x108);
                          *(uint *)(local_690.ray + 0x10c) =
                               (uint)bVar15 * auVar93._12_4_ |
                               (uint)!bVar15 * *(int *)(local_690.ray + 0x10c);
                          *(uint *)(local_690.ray + 0x110) =
                               (uint)bVar16 * auVar93._16_4_ |
                               (uint)!bVar16 * *(int *)(local_690.ray + 0x110);
                          *(uint *)(local_690.ray + 0x114) =
                               (uint)bVar17 * auVar93._20_4_ |
                               (uint)!bVar17 * *(int *)(local_690.ray + 0x114);
                          *(uint *)(local_690.ray + 0x118) =
                               (uint)bVar18 * auVar93._24_4_ |
                               (uint)!bVar18 * *(int *)(local_690.ray + 0x118);
                          *(uint *)(local_690.ray + 0x11c) =
                               (uint)bVar19 * auVar93._28_4_ |
                               (uint)!bVar19 * *(int *)(local_690.ray + 0x11c);
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar189 = ZEXT3264(auVar93);
                          auVar197 = ZEXT3264(local_5c0);
                          auVar198 = ZEXT3264(local_5e0);
                          auVar195 = ZEXT3264(local_600);
                          auVar194 = ZEXT3264(local_620);
                          if (local_580 != (undefined1  [32])0x0) {
                            bVar61 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar196._0_4_;
                        local_540._0_8_ = local_540._0_8_ ^ 1L << (local_4a0._0_8_ & 0x3f);
                        bVar61 = 0;
                        lVar28 = 0;
                        for (uVar62 = local_540._0_8_; (uVar62 & 1) == 0;
                            uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                          lVar28 = lVar28 + 1;
                        }
                        local_4a0._0_8_ = lVar28;
                      } while (local_540._0_8_ != 0);
                    }
                    bVar64 = (bool)(bVar64 | bVar61);
                  }
                }
                goto LAB_01ad8427;
              }
            }
            auVar188 = ZEXT3264(local_640);
            auVar187 = ZEXT3264(local_660);
          }
LAB_01ad8427:
          lVar65 = lVar65 + 8;
        } while ((int)lVar65 < iVar9);
      }
      if (bVar64) {
        return bVar64;
      }
      uVar125 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar29._4_4_ = uVar125;
      auVar29._0_4_ = uVar125;
      auVar29._8_4_ = uVar125;
      auVar29._12_4_ = uVar125;
      uVar25 = vcmpps_avx512vl(local_3d0,auVar29,2);
      uVar66 = (uint)uVar67 & (uint)uVar25;
      uVar67 = (ulong)uVar66;
    } while (uVar66 != 0);
  }
  return bVar64;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }